

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_sse2.h
# Opt level: O0

void VP8PlanarTo24b_SSE2(__m128i *in0,__m128i *in1,__m128i *in2,__m128i *in3,__m128i *in4,
                        __m128i *in5)

{
  byte bVar1;
  byte bVar9;
  byte bVar17;
  byte bVar25;
  byte bVar33;
  byte bVar41;
  byte bVar49;
  byte bVar57;
  byte bVar65;
  byte bVar73;
  byte bVar77;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong *in_RCX;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  ulong *in_R8;
  ulong *in_R9;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ushort uVar86;
  ulong uVar85;
  ushort uVar92;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  ushort uVar93;
  ulong uVar90;
  ushort uVar94;
  ulong uVar91;
  ushort uVar101;
  ushort uVar102;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  ushort uVar104;
  ulong uVar98;
  ushort uVar105;
  ulong uVar99;
  ushort uVar103;
  ushort uVar106;
  ulong uVar100;
  ushort uVar113;
  ushort uVar115;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  ushort uVar119;
  ulong uVar110;
  ushort uVar120;
  ulong uVar111;
  ushort uVar114;
  ushort uVar116;
  ushort uVar117;
  ushort uVar118;
  ushort uVar121;
  ushort uVar122;
  ulong uVar112;
  __m128i out0;
  __m128i v_mask_2;
  __m128i v_mask_1;
  __m128i v_mask;
  __m128i tmp5;
  __m128i tmp4;
  __m128i tmp3;
  __m128i tmp2;
  __m128i tmp1;
  __m128i tmp0;
  ushort local_b88;
  ushort uStack_b86;
  ushort uStack_b84;
  ushort uStack_b82;
  ushort uStack_b80;
  ushort uStack_b7e;
  ushort uStack_b7c;
  ushort uStack_b7a;
  ushort local_b78;
  ushort uStack_b76;
  ushort uStack_b74;
  ushort uStack_b72;
  ushort uStack_b70;
  ushort uStack_b6e;
  ushort uStack_b6c;
  ushort uStack_b6a;
  ushort local_b68;
  ushort uStack_b66;
  ushort uStack_b64;
  ushort uStack_b62;
  ushort uStack_b60;
  ushort uStack_b5e;
  ushort uStack_b5c;
  ushort uStack_b5a;
  ushort local_b58;
  ushort uStack_b56;
  ushort uStack_b54;
  ushort uStack_b52;
  ushort uStack_b50;
  ushort uStack_b4e;
  ushort uStack_b4c;
  ushort uStack_b4a;
  ushort local_b48;
  ushort uStack_b46;
  ushort uStack_b44;
  ushort uStack_b42;
  ushort uStack_b40;
  ushort uStack_b3e;
  ushort uStack_b3c;
  ushort uStack_b3a;
  ushort local_b38;
  ushort uStack_b36;
  ushort uStack_b34;
  ushort uStack_b32;
  ushort uStack_b30;
  ushort uStack_b2e;
  ushort uStack_b2c;
  ushort uStack_b2a;
  ushort local_ac8;
  ushort uStack_ac6;
  ushort uStack_ac4;
  ushort uStack_ac2;
  ushort uStack_ac0;
  ushort uStack_abe;
  ushort uStack_abc;
  ushort uStack_aba;
  ushort local_ab8;
  ushort uStack_ab6;
  ushort uStack_ab4;
  ushort uStack_ab2;
  ushort uStack_ab0;
  ushort uStack_aae;
  ushort uStack_aac;
  ushort uStack_aaa;
  ushort local_aa8;
  ushort uStack_aa6;
  ushort uStack_aa4;
  ushort uStack_aa2;
  ushort uStack_aa0;
  ushort uStack_a9e;
  ushort uStack_a9c;
  ushort uStack_a9a;
  ushort local_a98;
  ushort uStack_a96;
  ushort uStack_a94;
  ushort uStack_a92;
  ushort uStack_a90;
  ushort uStack_a8e;
  ushort uStack_a8c;
  ushort uStack_a8a;
  ushort local_a88;
  ushort uStack_a86;
  ushort uStack_a84;
  ushort uStack_a82;
  ushort uStack_a80;
  ushort uStack_a7e;
  ushort uStack_a7c;
  ushort uStack_a7a;
  ushort local_a78;
  ushort uStack_a76;
  ushort uStack_a74;
  ushort uStack_a72;
  ushort uStack_a70;
  ushort uStack_a6e;
  ushort uStack_a6c;
  ushort uStack_a6a;
  ushort local_a08;
  ushort uStack_a06;
  ushort uStack_a04;
  ushort uStack_a02;
  ushort uStack_a00;
  ushort uStack_9fe;
  ushort uStack_9fc;
  ushort uStack_9fa;
  ushort local_9f8;
  ushort uStack_9f6;
  ushort uStack_9f4;
  ushort uStack_9f2;
  ushort uStack_9f0;
  ushort uStack_9ee;
  ushort uStack_9ec;
  ushort uStack_9ea;
  ushort local_9e8;
  ushort uStack_9e6;
  ushort uStack_9e4;
  ushort uStack_9e2;
  ushort uStack_9e0;
  ushort uStack_9de;
  ushort uStack_9dc;
  ushort uStack_9da;
  ushort local_9d8;
  ushort uStack_9d6;
  ushort uStack_9d4;
  ushort uStack_9d2;
  ushort uStack_9d0;
  ushort uStack_9ce;
  ushort uStack_9cc;
  ushort uStack_9ca;
  ushort local_9c8;
  ushort uStack_9c6;
  ushort uStack_9c4;
  ushort uStack_9c2;
  ushort uStack_9c0;
  ushort uStack_9be;
  ushort uStack_9bc;
  ushort uStack_9ba;
  ushort local_9b8;
  ushort uStack_9b6;
  ushort uStack_9b4;
  ushort uStack_9b2;
  ushort uStack_9b0;
  ushort uStack_9ae;
  ushort uStack_9ac;
  ushort uStack_9aa;
  ushort local_948;
  ushort uStack_946;
  ushort uStack_944;
  ushort uStack_942;
  ushort uStack_940;
  ushort uStack_93e;
  ushort uStack_93c;
  ushort uStack_93a;
  ushort local_938;
  ushort uStack_936;
  ushort uStack_934;
  ushort uStack_932;
  ushort uStack_930;
  ushort uStack_92e;
  ushort uStack_92c;
  ushort uStack_92a;
  ushort local_928;
  ushort uStack_926;
  ushort uStack_924;
  ushort uStack_922;
  ushort uStack_920;
  ushort uStack_91e;
  ushort uStack_91c;
  ushort uStack_91a;
  ushort local_918;
  ushort uStack_916;
  ushort uStack_914;
  ushort uStack_912;
  ushort uStack_910;
  ushort uStack_90e;
  ushort uStack_90c;
  ushort uStack_90a;
  ushort local_908;
  ushort uStack_906;
  ushort uStack_904;
  ushort uStack_902;
  ushort uStack_900;
  ushort uStack_8fe;
  ushort uStack_8fc;
  ushort uStack_8fa;
  ushort local_8f8;
  ushort uStack_8f6;
  ushort uStack_8f4;
  ushort uStack_8f2;
  ushort uStack_8f0;
  ushort uStack_8ee;
  ushort uStack_8ec;
  ushort uStack_8ea;
  ushort local_888;
  ushort uStack_886;
  ushort uStack_884;
  ushort uStack_882;
  ushort uStack_880;
  ushort uStack_87e;
  ushort uStack_87c;
  ushort uStack_87a;
  ushort local_878;
  ushort uStack_876;
  ushort uStack_874;
  ushort uStack_872;
  ushort uStack_870;
  ushort uStack_86e;
  ushort uStack_86c;
  ushort uStack_86a;
  ushort local_868;
  ushort uStack_866;
  ushort uStack_864;
  ushort uStack_862;
  ushort uStack_860;
  ushort uStack_85e;
  ushort uStack_85c;
  ushort uStack_85a;
  ushort local_858;
  ushort uStack_856;
  ushort uStack_854;
  ushort uStack_852;
  ushort uStack_850;
  ushort uStack_84e;
  ushort uStack_84c;
  ushort uStack_84a;
  ushort local_848;
  ushort uStack_846;
  ushort uStack_844;
  ushort uStack_842;
  ushort uStack_840;
  ushort uStack_83e;
  ushort uStack_83c;
  ushort uStack_83a;
  ushort local_838;
  ushort uStack_836;
  ushort uStack_834;
  ushort uStack_832;
  ushort uStack_830;
  ushort uStack_82e;
  ushort uStack_82c;
  ushort uStack_82a;
  ushort uStack_776;
  ushort uStack_774;
  ushort uStack_772;
  ushort uStack_76e;
  ushort uStack_76c;
  ushort uStack_76a;
  ushort uStack_756;
  ushort uStack_754;
  ushort uStack_752;
  ushort uStack_74e;
  ushort uStack_74c;
  ushort uStack_74a;
  ushort uStack_736;
  ushort uStack_734;
  ushort uStack_732;
  ushort uStack_72e;
  ushort uStack_72c;
  ushort uStack_72a;
  ushort uStack_716;
  ushort uStack_714;
  ushort uStack_712;
  ushort uStack_70e;
  ushort uStack_70c;
  ushort uStack_70a;
  ushort uStack_6f6;
  ushort uStack_6f4;
  ushort uStack_6f2;
  ushort uStack_6ee;
  ushort uStack_6ec;
  ushort uStack_6ea;
  ushort uStack_6d6;
  ushort uStack_6d4;
  ushort uStack_6d2;
  ushort uStack_6ce;
  ushort uStack_6cc;
  ushort uStack_6ca;
  ushort uStack_6b6;
  ushort uStack_6b4;
  ushort uStack_6b2;
  ushort uStack_6ae;
  ushort uStack_6ac;
  ushort uStack_6aa;
  ushort uStack_696;
  ushort uStack_694;
  ushort uStack_692;
  ushort uStack_68e;
  ushort uStack_68c;
  ushort uStack_68a;
  ushort uStack_676;
  ushort uStack_674;
  ushort uStack_672;
  ushort uStack_66e;
  ushort uStack_66c;
  ushort uStack_66a;
  ushort uStack_656;
  ushort uStack_654;
  ushort uStack_652;
  ushort uStack_64e;
  ushort uStack_64c;
  ushort uStack_64a;
  ushort uStack_636;
  ushort uStack_634;
  ushort uStack_632;
  ushort uStack_62e;
  ushort uStack_62c;
  ushort uStack_62a;
  ushort uStack_616;
  ushort uStack_614;
  ushort uStack_612;
  ushort uStack_60e;
  ushort uStack_60c;
  ushort uStack_60a;
  ushort local_5f8;
  ushort uStack_5f6;
  ushort uStack_5f4;
  ushort uStack_5f2;
  ushort uStack_5f0;
  ushort uStack_5ee;
  ushort uStack_5ec;
  ushort uStack_5ea;
  ushort local_5d8;
  ushort uStack_5d6;
  ushort uStack_5d4;
  ushort uStack_5d2;
  ushort uStack_5d0;
  ushort uStack_5ce;
  ushort uStack_5cc;
  ushort uStack_5ca;
  ushort local_5b8;
  ushort uStack_5b6;
  ushort uStack_5b4;
  ushort uStack_5b2;
  ushort uStack_5b0;
  ushort uStack_5ae;
  ushort uStack_5ac;
  ushort uStack_5aa;
  ushort local_598;
  ushort uStack_596;
  ushort uStack_594;
  ushort uStack_592;
  ushort uStack_590;
  ushort uStack_58e;
  ushort uStack_58c;
  ushort uStack_58a;
  ushort local_578;
  ushort uStack_576;
  ushort uStack_574;
  ushort uStack_572;
  ushort uStack_570;
  ushort uStack_56e;
  ushort uStack_56c;
  ushort uStack_56a;
  ushort local_558;
  ushort uStack_556;
  ushort uStack_554;
  ushort uStack_552;
  ushort uStack_550;
  ushort uStack_54e;
  ushort uStack_54c;
  ushort uStack_54a;
  ushort uStack_536;
  ushort uStack_534;
  ushort uStack_532;
  ushort uStack_52e;
  ushort uStack_52c;
  ushort uStack_52a;
  ushort uStack_516;
  ushort uStack_514;
  ushort uStack_512;
  ushort uStack_50e;
  ushort uStack_50c;
  ushort uStack_50a;
  ushort uStack_4f6;
  ushort uStack_4f4;
  ushort uStack_4f2;
  ushort uStack_4ee;
  ushort uStack_4ec;
  ushort uStack_4ea;
  ushort uStack_4d6;
  ushort uStack_4d4;
  ushort uStack_4d2;
  ushort uStack_4ce;
  ushort uStack_4cc;
  ushort uStack_4ca;
  ushort uStack_4b6;
  ushort uStack_4b4;
  ushort uStack_4b2;
  ushort uStack_4ae;
  ushort uStack_4ac;
  ushort uStack_4aa;
  ushort uStack_496;
  ushort uStack_494;
  ushort uStack_492;
  ushort uStack_48e;
  ushort uStack_48c;
  ushort uStack_48a;
  ushort local_478;
  ushort uStack_476;
  ushort uStack_474;
  ushort uStack_472;
  ushort uStack_470;
  ushort uStack_46e;
  ushort uStack_46c;
  ushort uStack_46a;
  ushort local_458;
  ushort uStack_456;
  ushort uStack_454;
  ushort uStack_452;
  ushort uStack_450;
  ushort uStack_44e;
  ushort uStack_44c;
  ushort uStack_44a;
  ushort local_438;
  ushort uStack_436;
  ushort uStack_434;
  ushort uStack_432;
  ushort uStack_430;
  ushort uStack_42e;
  ushort uStack_42c;
  ushort uStack_42a;
  ushort local_418;
  ushort uStack_416;
  ushort uStack_414;
  ushort uStack_412;
  ushort uStack_410;
  ushort uStack_40e;
  ushort uStack_40c;
  ushort uStack_40a;
  ushort local_3f8;
  ushort uStack_3f6;
  ushort uStack_3f4;
  ushort uStack_3f2;
  ushort uStack_3f0;
  ushort uStack_3ee;
  ushort uStack_3ec;
  ushort uStack_3ea;
  ushort local_3d8;
  ushort uStack_3d6;
  ushort uStack_3d4;
  ushort uStack_3d2;
  ushort uStack_3d0;
  ushort uStack_3ce;
  ushort uStack_3cc;
  ushort uStack_3ca;
  __m128i v_mask_4;
  __m128i v_mask_3;
  __m128i out5;
  __m128i out4;
  __m128i out3;
  __m128i out2;
  __m128i out1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  byte bVar50;
  byte bVar51;
  byte bVar52;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  byte bVar56;
  byte bVar58;
  byte bVar59;
  byte bVar60;
  byte bVar61;
  byte bVar62;
  byte bVar63;
  byte bVar64;
  byte bVar66;
  byte bVar67;
  byte bVar68;
  byte bVar69;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  byte bVar74;
  byte bVar75;
  byte bVar76;
  byte bVar78;
  
  uVar95 = *in_RDI & 0xff00ff00ff00ff;
  uVar107 = in_RDI[1] & 0xff00ff00ff00ff;
  uVar82 = *in_RSI & 0xff00ff00ff00ff;
  uVar87 = in_RSI[1] & 0xff00ff00ff00ff;
  local_838 = (ushort)uVar95;
  uStack_836 = (ushort)(uVar95 >> 0x10);
  uStack_834 = (ushort)(uVar95 >> 0x20);
  uStack_832 = (ushort)(uVar95 >> 0x30);
  uStack_830 = (ushort)uVar107;
  uStack_82e = (ushort)(uVar107 >> 0x10);
  uStack_82c = (ushort)(uVar107 >> 0x20);
  uStack_82a = (ushort)(uVar107 >> 0x30);
  local_848 = (ushort)uVar82;
  uStack_846 = (ushort)(uVar82 >> 0x10);
  uStack_844 = (ushort)(uVar82 >> 0x20);
  uStack_842 = (ushort)(uVar82 >> 0x30);
  uStack_840 = (ushort)uVar87;
  uStack_83e = (ushort)(uVar87 >> 0x10);
  uStack_83c = (ushort)(uVar87 >> 0x20);
  uStack_83a = (ushort)(uVar87 >> 0x30);
  bVar1 = (uStack_836 != 0) * (uStack_836 < 0x100) * (char)(uVar95 >> 0x10) - (0xff < uStack_836);
  bVar2 = (uStack_832 != 0) * (uStack_832 < 0x100) * (char)(uVar95 >> 0x30) - (0xff < uStack_832);
  bVar3 = (uStack_82e != 0) * (uStack_82e < 0x100) * (char)(uVar107 >> 0x10) - (0xff < uStack_82e);
  bVar4 = (uStack_82a != 0) * (uStack_82a < 0x100) * (char)(uVar107 >> 0x30) - (0xff < uStack_82a);
  bVar5 = (uStack_846 != 0) * (uStack_846 < 0x100) * (char)(uVar82 >> 0x10) - (0xff < uStack_846);
  bVar6 = (uStack_842 != 0) * (uStack_842 < 0x100) * (char)(uVar82 >> 0x30) - (0xff < uStack_842);
  bVar7 = (uStack_83e != 0) * (uStack_83e < 0x100) * (char)(uVar87 >> 0x10) - (0xff < uStack_83e);
  bVar8 = (uStack_83a != 0) * (uStack_83a < 0x100) * (char)(uVar87 >> 0x30) - (0xff < uStack_83a);
  uVar96 = *in_RDX & 0xff00ff00ff00ff;
  uVar108 = in_RDX[1] & 0xff00ff00ff00ff;
  uVar83 = *in_RCX & 0xff00ff00ff00ff;
  uVar88 = in_RCX[1] & 0xff00ff00ff00ff;
  local_858 = (ushort)uVar96;
  uStack_856 = (ushort)(uVar96 >> 0x10);
  uStack_854 = (ushort)(uVar96 >> 0x20);
  uStack_852 = (ushort)(uVar96 >> 0x30);
  uStack_850 = (ushort)uVar108;
  uStack_84e = (ushort)(uVar108 >> 0x10);
  uStack_84c = (ushort)(uVar108 >> 0x20);
  uStack_84a = (ushort)(uVar108 >> 0x30);
  local_868 = (ushort)uVar83;
  uStack_866 = (ushort)(uVar83 >> 0x10);
  uStack_864 = (ushort)(uVar83 >> 0x20);
  uStack_862 = (ushort)(uVar83 >> 0x30);
  uStack_860 = (ushort)uVar88;
  uStack_85e = (ushort)(uVar88 >> 0x10);
  uStack_85c = (ushort)(uVar88 >> 0x20);
  uStack_85a = (ushort)(uVar88 >> 0x30);
  bVar9 = (uStack_856 != 0) * (uStack_856 < 0x100) * (char)(uVar96 >> 0x10) - (0xff < uStack_856);
  bVar10 = (uStack_852 != 0) * (uStack_852 < 0x100) * (char)(uVar96 >> 0x30) - (0xff < uStack_852);
  bVar11 = (uStack_84e != 0) * (uStack_84e < 0x100) * (char)(uVar108 >> 0x10) - (0xff < uStack_84e);
  bVar12 = (uStack_84a != 0) * (uStack_84a < 0x100) * (char)(uVar108 >> 0x30) - (0xff < uStack_84a);
  bVar13 = (uStack_866 != 0) * (uStack_866 < 0x100) * (char)(uVar83 >> 0x10) - (0xff < uStack_866);
  bVar14 = (uStack_862 != 0) * (uStack_862 < 0x100) * (char)(uVar83 >> 0x30) - (0xff < uStack_862);
  bVar15 = (uStack_85e != 0) * (uStack_85e < 0x100) * (char)(uVar88 >> 0x10) - (0xff < uStack_85e);
  bVar16 = (uStack_85a != 0) * (uStack_85a < 0x100) * (char)(uVar88 >> 0x30) - (0xff < uStack_85a);
  uVar97 = *in_R8 & 0xff00ff00ff00ff;
  uVar109 = in_R8[1] & 0xff00ff00ff00ff;
  uVar84 = *in_R9 & 0xff00ff00ff00ff;
  uVar89 = in_R9[1] & 0xff00ff00ff00ff;
  local_878 = (ushort)uVar97;
  uStack_876 = (ushort)(uVar97 >> 0x10);
  uStack_874 = (ushort)(uVar97 >> 0x20);
  uStack_872 = (ushort)(uVar97 >> 0x30);
  uStack_870 = (ushort)uVar109;
  uStack_86e = (ushort)(uVar109 >> 0x10);
  uStack_86c = (ushort)(uVar109 >> 0x20);
  uStack_86a = (ushort)(uVar109 >> 0x30);
  local_888 = (ushort)uVar84;
  uStack_886 = (ushort)(uVar84 >> 0x10);
  uStack_884 = (ushort)(uVar84 >> 0x20);
  uStack_882 = (ushort)(uVar84 >> 0x30);
  uStack_880 = (ushort)uVar89;
  uStack_87e = (ushort)(uVar89 >> 0x10);
  uStack_87c = (ushort)(uVar89 >> 0x20);
  uStack_87a = (ushort)(uVar89 >> 0x30);
  bVar17 = (uStack_876 != 0) * (uStack_876 < 0x100) * (char)(uVar97 >> 0x10) - (0xff < uStack_876);
  bVar18 = (uStack_872 != 0) * (uStack_872 < 0x100) * (char)(uVar97 >> 0x30) - (0xff < uStack_872);
  bVar19 = (uStack_86e != 0) * (uStack_86e < 0x100) * (char)(uVar109 >> 0x10) - (0xff < uStack_86e);
  bVar20 = (uStack_86a != 0) * (uStack_86a < 0x100) * (char)(uVar109 >> 0x30) - (0xff < uStack_86a);
  bVar21 = (uStack_886 != 0) * (uStack_886 < 0x100) * (char)(uVar84 >> 0x10) - (0xff < uStack_886);
  bVar22 = (uStack_882 != 0) * (uStack_882 < 0x100) * (char)(uVar84 >> 0x30) - (0xff < uStack_882);
  bVar23 = (uStack_87e != 0) * (uStack_87e < 0x100) * (char)(uVar89 >> 0x10) - (0xff < uStack_87e);
  bVar24 = (uStack_87a != 0) * (uStack_87a < 0x100) * (char)(uVar89 >> 0x30) - (0xff < uStack_87a);
  uVar85 = *in_RDI;
  uVar90 = in_RDI[1];
  local_3d8 = (ushort)uVar85;
  uStack_3d6 = (ushort)(uVar85 >> 0x10);
  uStack_3d4 = (ushort)(uVar85 >> 0x20);
  uStack_3d0 = (ushort)uVar90;
  uStack_3ce = (ushort)(uVar90 >> 0x10);
  uStack_3cc = (ushort)(uVar90 >> 0x20);
  local_3d8 = local_3d8 >> 8;
  uStack_3d6 = uStack_3d6 >> 8;
  uStack_3d4 = uStack_3d4 >> 8;
  uVar104 = (ushort)(uVar85 >> 0x38);
  uStack_3d0 = uStack_3d0 >> 8;
  uStack_3ce = uStack_3ce >> 8;
  uStack_3cc = uStack_3cc >> 8;
  uVar119 = (ushort)(uVar90 >> 0x38);
  uVar98 = *in_RSI;
  uVar110 = in_RSI[1];
  local_3f8 = (ushort)uVar98;
  uStack_3f6 = (ushort)(uVar98 >> 0x10);
  uStack_3f4 = (ushort)(uVar98 >> 0x20);
  uStack_3f0 = (ushort)uVar110;
  uStack_3ee = (ushort)(uVar110 >> 0x10);
  uStack_3ec = (ushort)(uVar110 >> 0x20);
  local_3f8 = local_3f8 >> 8;
  uStack_3f6 = uStack_3f6 >> 8;
  uStack_3f4 = uStack_3f4 >> 8;
  uVar86 = (ushort)(uVar98 >> 0x38);
  uStack_3f0 = uStack_3f0 >> 8;
  uStack_3ee = uStack_3ee >> 8;
  uStack_3ec = uStack_3ec >> 8;
  uVar93 = (ushort)(uVar110 >> 0x38);
  bVar25 = (uStack_3d6 != 0) * (uStack_3d6 < 0x100) * (char)(uVar85 >> 0x18) - (0xff < uStack_3d6);
  bVar26 = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar85 >> 0x38) - (0xff < uVar104);
  bVar27 = (uStack_3ce != 0) * (uStack_3ce < 0x100) * (char)(uVar90 >> 0x18) - (0xff < uStack_3ce);
  bVar28 = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar90 >> 0x38) - (0xff < uVar119);
  bVar29 = (uStack_3f6 != 0) * (uStack_3f6 < 0x100) * (char)(uVar98 >> 0x18) - (0xff < uStack_3f6);
  bVar30 = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar98 >> 0x38) - (0xff < uVar86);
  bVar31 = (uStack_3ee != 0) * (uStack_3ee < 0x100) * (char)(uVar110 >> 0x18) - (0xff < uStack_3ee);
  bVar32 = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar110 >> 0x38) - (0xff < uVar93);
  uVar91 = *in_RDX;
  uVar99 = in_RDX[1];
  local_418 = (ushort)uVar91;
  uStack_416 = (ushort)(uVar91 >> 0x10);
  uStack_414 = (ushort)(uVar91 >> 0x20);
  uStack_410 = (ushort)uVar99;
  uStack_40e = (ushort)(uVar99 >> 0x10);
  uStack_40c = (ushort)(uVar99 >> 0x20);
  local_418 = local_418 >> 8;
  uStack_416 = uStack_416 >> 8;
  uStack_414 = uStack_414 >> 8;
  uVar104 = (ushort)(uVar91 >> 0x38);
  uStack_410 = uStack_410 >> 8;
  uStack_40e = uStack_40e >> 8;
  uStack_40c = uStack_40c >> 8;
  uVar119 = (ushort)(uVar99 >> 0x38);
  uVar100 = *in_RCX;
  uVar111 = in_RCX[1];
  local_438 = (ushort)uVar100;
  uStack_436 = (ushort)(uVar100 >> 0x10);
  uStack_434 = (ushort)(uVar100 >> 0x20);
  uStack_430 = (ushort)uVar111;
  uStack_42e = (ushort)(uVar111 >> 0x10);
  uStack_42c = (ushort)(uVar111 >> 0x20);
  local_438 = local_438 >> 8;
  uStack_436 = uStack_436 >> 8;
  uStack_434 = uStack_434 >> 8;
  uVar86 = (ushort)(uVar100 >> 0x38);
  uStack_430 = uStack_430 >> 8;
  uStack_42e = uStack_42e >> 8;
  uStack_42c = uStack_42c >> 8;
  uVar93 = (ushort)(uVar111 >> 0x38);
  bVar33 = (uStack_416 != 0) * (uStack_416 < 0x100) * (char)(uVar91 >> 0x18) - (0xff < uStack_416);
  bVar34 = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar91 >> 0x38) - (0xff < uVar104);
  bVar35 = (uStack_40e != 0) * (uStack_40e < 0x100) * (char)(uVar99 >> 0x18) - (0xff < uStack_40e);
  bVar36 = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar99 >> 0x38) - (0xff < uVar119);
  bVar37 = (uStack_436 != 0) * (uStack_436 < 0x100) * (char)(uVar100 >> 0x18) - (0xff < uStack_436);
  bVar38 = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar100 >> 0x38) - (0xff < uVar86);
  bVar39 = (uStack_42e != 0) * (uStack_42e < 0x100) * (char)(uVar111 >> 0x18) - (0xff < uStack_42e);
  bVar40 = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar111 >> 0x38) - (0xff < uVar93);
  uVar112 = *in_R8;
  uVar79 = in_R8[1];
  local_458 = (ushort)uVar112;
  uStack_456 = (ushort)(uVar112 >> 0x10);
  uStack_454 = (ushort)(uVar112 >> 0x20);
  uStack_450 = (ushort)uVar79;
  uStack_44e = (ushort)(uVar79 >> 0x10);
  uStack_44c = (ushort)(uVar79 >> 0x20);
  local_458 = local_458 >> 8;
  uStack_456 = uStack_456 >> 8;
  uStack_454 = uStack_454 >> 8;
  uVar104 = (ushort)(uVar112 >> 0x38);
  uStack_450 = uStack_450 >> 8;
  uStack_44e = uStack_44e >> 8;
  uStack_44c = uStack_44c >> 8;
  uVar119 = (ushort)(uVar79 >> 0x38);
  uVar80 = *in_R9;
  uVar81 = in_R9[1];
  local_478 = (ushort)uVar80;
  uStack_476 = (ushort)(uVar80 >> 0x10);
  uStack_474 = (ushort)(uVar80 >> 0x20);
  uStack_470 = (ushort)uVar81;
  uStack_46e = (ushort)(uVar81 >> 0x10);
  uStack_46c = (ushort)(uVar81 >> 0x20);
  local_478 = local_478 >> 8;
  uStack_476 = uStack_476 >> 8;
  uStack_474 = uStack_474 >> 8;
  uVar86 = (ushort)(uVar80 >> 0x38);
  uStack_470 = uStack_470 >> 8;
  uStack_46e = uStack_46e >> 8;
  uStack_46c = uStack_46c >> 8;
  uVar93 = (ushort)(uVar81 >> 0x38);
  bVar41 = (uStack_456 != 0) * (uStack_456 < 0x100) * (char)(uVar112 >> 0x18) - (0xff < uStack_456);
  bVar42 = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar112 >> 0x38) - (0xff < uVar104);
  bVar43 = (uStack_44e != 0) * (uStack_44e < 0x100) * (char)(uVar79 >> 0x18) - (0xff < uStack_44e);
  bVar44 = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar79 >> 0x38) - (0xff < uVar119);
  bVar45 = (uStack_476 != 0) * (uStack_476 < 0x100) * (char)(uVar80 >> 0x18) - (0xff < uStack_476);
  bVar46 = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar80 >> 0x38) - (0xff < uVar86);
  bVar47 = (uStack_46e != 0) * (uStack_46e < 0x100) * (char)(uVar81 >> 0x18) - (0xff < uStack_46e);
  bVar48 = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar81 >> 0x38) - (0xff < uVar93);
  uVar95 = (ulong)CONCAT16((uStack_82c != 0) * (uStack_82c < 0x100) * (char)(uVar107 >> 0x20) -
                           (0xff < uStack_82c),
                           CONCAT15(bVar3,CONCAT14((uStack_830 != 0) * (uStack_830 < 0x100) *
                                                   (char)uVar107 - (0xff < uStack_830),
                                                   CONCAT13(bVar2,CONCAT12((uStack_834 != 0) *
                                                                           (uStack_834 < 0x100) *
                                                                           (char)(uVar95 >> 0x20) -
                                                                           (0xff < uStack_834),
                                                                           CONCAT11(bVar1,(local_838
                                                                                          != 0) * (
                                                  local_838 < 0x100) * (char)uVar95 -
                                                  (0xff < local_838))))))) & 0xff00ff00ff00ff;
  uVar87 = (ulong)CONCAT16((uStack_83c != 0) * (uStack_83c < 0x100) * (char)(uVar87 >> 0x20) -
                           (0xff < uStack_83c),
                           CONCAT15(bVar7,CONCAT14((uStack_840 != 0) * (uStack_840 < 0x100) *
                                                   (char)uVar87 - (0xff < uStack_840),
                                                   CONCAT13(bVar6,CONCAT12((uStack_844 != 0) *
                                                                           (uStack_844 < 0x100) *
                                                                           (char)(uVar82 >> 0x20) -
                                                                           (0xff < uStack_844),
                                                                           CONCAT11(bVar5,(local_848
                                                                                          != 0) * (
                                                  local_848 < 0x100) * (char)uVar82 -
                                                  (0xff < local_848))))))) & 0xff00ff00ff00ff;
  uVar82 = (ulong)CONCAT16((uStack_84c != 0) * (uStack_84c < 0x100) * (char)(uVar108 >> 0x20) -
                           (0xff < uStack_84c),
                           CONCAT15(bVar11,CONCAT14((uStack_850 != 0) * (uStack_850 < 0x100) *
                                                    (char)uVar108 - (0xff < uStack_850),
                                                    CONCAT13(bVar10,CONCAT12((uStack_854 != 0) *
                                                                             (uStack_854 < 0x100) *
                                                                             (char)(uVar96 >> 0x20)
                                                                             - (0xff < uStack_854),
                                                                             CONCAT11(bVar9,(
                                                  local_858 != 0) * (local_858 < 0x100) *
                                                  (char)uVar96 - (0xff < local_858))))))) &
           0xff00ff00ff00ff;
  uVar83 = (ulong)CONCAT16((uStack_85c != 0) * (uStack_85c < 0x100) * (char)(uVar88 >> 0x20) -
                           (0xff < uStack_85c),
                           CONCAT15(bVar15,CONCAT14((uStack_860 != 0) * (uStack_860 < 0x100) *
                                                    (char)uVar88 - (0xff < uStack_860),
                                                    CONCAT13(bVar14,CONCAT12((uStack_864 != 0) *
                                                                             (uStack_864 < 0x100) *
                                                                             (char)(uVar83 >> 0x20)
                                                                             - (0xff < uStack_864),
                                                                             CONCAT11(bVar13,(
                                                  local_868 != 0) * (local_868 < 0x100) *
                                                  (char)uVar83 - (0xff < local_868))))))) &
           0xff00ff00ff00ff;
  local_8f8 = (ushort)uVar95;
  uStack_8f6 = (ushort)(uVar95 >> 0x10);
  uStack_8f4 = (ushort)(uVar95 >> 0x20);
  uStack_8f2 = (ushort)(uVar95 >> 0x30);
  uStack_8f0 = (ushort)uVar87;
  uStack_8ee = (ushort)(uVar87 >> 0x10);
  uStack_8ec = (ushort)(uVar87 >> 0x20);
  uStack_8ea = (ushort)(uVar87 >> 0x30);
  local_908 = (ushort)uVar82;
  uStack_906 = (ushort)(uVar82 >> 0x10);
  uStack_904 = (ushort)(uVar82 >> 0x20);
  uStack_902 = (ushort)(uVar82 >> 0x30);
  uStack_900 = (ushort)uVar83;
  uStack_8fe = (ushort)(uVar83 >> 0x10);
  uStack_8fc = (ushort)(uVar83 >> 0x20);
  uStack_8fa = (ushort)(uVar83 >> 0x30);
  *(char *)in_RDI = (local_8f8 != 0) * (local_8f8 < 0x100) * (char)uVar95 - (0xff < local_8f8);
  *(char *)((long)in_RDI + 1) =
       (uStack_8f6 != 0) * (uStack_8f6 < 0x100) * (char)(uVar95 >> 0x10) - (0xff < uStack_8f6);
  *(char *)((long)in_RDI + 2) =
       (uStack_8f4 != 0) * (uStack_8f4 < 0x100) * (char)(uVar95 >> 0x20) - (0xff < uStack_8f4);
  *(char *)((long)in_RDI + 3) =
       (uStack_8f2 != 0) * (uStack_8f2 < 0x100) * (char)(uVar95 >> 0x30) - (0xff < uStack_8f2);
  *(char *)((long)in_RDI + 4) =
       (uStack_8f0 != 0) * (uStack_8f0 < 0x100) * (char)uVar87 - (0xff < uStack_8f0);
  *(char *)((long)in_RDI + 5) =
       (uStack_8ee != 0) * (uStack_8ee < 0x100) * (char)(uVar87 >> 0x10) - (0xff < uStack_8ee);
  *(char *)((long)in_RDI + 6) =
       (uStack_8ec != 0) * (uStack_8ec < 0x100) * (char)(uVar87 >> 0x20) - (0xff < uStack_8ec);
  *(char *)((long)in_RDI + 7) =
       (uStack_8ea != 0) * (uStack_8ea < 0x100) * (char)(uVar87 >> 0x30) - (0xff < uStack_8ea);
  *(char *)(in_RDI + 1) = (local_908 != 0) * (local_908 < 0x100) * (char)uVar82 - (0xff < local_908)
  ;
  *(char *)((long)in_RDI + 9) =
       (uStack_906 != 0) * (uStack_906 < 0x100) * (char)(uVar82 >> 0x10) - (0xff < uStack_906);
  *(char *)((long)in_RDI + 10) =
       (uStack_904 != 0) * (uStack_904 < 0x100) * (char)(uVar82 >> 0x20) - (0xff < uStack_904);
  *(char *)((long)in_RDI + 0xb) =
       (uStack_902 != 0) * (uStack_902 < 0x100) * (char)(uVar82 >> 0x30) - (0xff < uStack_902);
  *(char *)((long)in_RDI + 0xc) =
       (uStack_900 != 0) * (uStack_900 < 0x100) * (char)uVar83 - (0xff < uStack_900);
  *(char *)((long)in_RDI + 0xd) =
       (uStack_8fe != 0) * (uStack_8fe < 0x100) * (char)(uVar83 >> 0x10) - (0xff < uStack_8fe);
  *(char *)((long)in_RDI + 0xe) =
       (uStack_8fc != 0) * (uStack_8fc < 0x100) * (char)(uVar83 >> 0x20) - (0xff < uStack_8fc);
  *(char *)((long)in_RDI + 0xf) =
       (uStack_8fa != 0) * (uStack_8fa < 0x100) * (char)(uVar83 >> 0x30) - (0xff < uStack_8fa);
  uVar82 = (ulong)CONCAT16((uStack_86c != 0) * (uStack_86c < 0x100) * (char)(uVar109 >> 0x20) -
                           (0xff < uStack_86c),
                           CONCAT15(bVar19,CONCAT14((uStack_870 != 0) * (uStack_870 < 0x100) *
                                                    (char)uVar109 - (0xff < uStack_870),
                                                    CONCAT13(bVar18,CONCAT12((uStack_874 != 0) *
                                                                             (uStack_874 < 0x100) *
                                                                             (char)(uVar97 >> 0x20)
                                                                             - (0xff < uStack_874),
                                                                             CONCAT11(bVar17,(
                                                  local_878 != 0) * (local_878 < 0x100) *
                                                  (char)uVar97 - (0xff < local_878))))))) &
           0xff00ff00ff00ff;
  uVar83 = (ulong)CONCAT16((uStack_87c != 0) * (uStack_87c < 0x100) * (char)(uVar89 >> 0x20) -
                           (0xff < uStack_87c),
                           CONCAT15(bVar23,CONCAT14((uStack_880 != 0) * (uStack_880 < 0x100) *
                                                    (char)uVar89 - (0xff < uStack_880),
                                                    CONCAT13(bVar22,CONCAT12((uStack_884 != 0) *
                                                                             (uStack_884 < 0x100) *
                                                                             (char)(uVar84 >> 0x20)
                                                                             - (0xff < uStack_884),
                                                                             CONCAT11(bVar21,(
                                                  local_888 != 0) * (local_888 < 0x100) *
                                                  (char)uVar84 - (0xff < local_888))))))) &
           0xff00ff00ff00ff;
  uVar85 = (ulong)CONCAT16((uStack_3cc != 0) * (uStack_3cc < 0x100) * (char)(uVar90 >> 0x28) -
                           (0xff < uStack_3cc),
                           CONCAT15(bVar27,CONCAT14((uStack_3d0 != 0) * (uStack_3d0 < 0x100) *
                                                    (char)(uVar90 >> 8) - (0xff < uStack_3d0),
                                                    CONCAT13(bVar26,CONCAT12((uStack_3d4 != 0) *
                                                                             (uStack_3d4 < 0x100) *
                                                                             (char)(uVar85 >> 0x28)
                                                                             - (0xff < uStack_3d4),
                                                                             CONCAT11(bVar25,(
                                                  local_3d8 != 0) * (local_3d8 < 0x100) *
                                                  (char)(uVar85 >> 8) - (0xff < local_3d8))))))) &
           0xff00ff00ff00ff;
  uVar90 = (ulong)CONCAT16((uStack_3ec != 0) * (uStack_3ec < 0x100) * (char)(uVar110 >> 0x28) -
                           (0xff < uStack_3ec),
                           CONCAT15(bVar31,CONCAT14((uStack_3f0 != 0) * (uStack_3f0 < 0x100) *
                                                    (char)(uVar110 >> 8) - (0xff < uStack_3f0),
                                                    CONCAT13(bVar30,CONCAT12((uStack_3f4 != 0) *
                                                                             (uStack_3f4 < 0x100) *
                                                                             (char)(uVar98 >> 0x28)
                                                                             - (0xff < uStack_3f4),
                                                                             CONCAT11(bVar29,(
                                                  local_3f8 != 0) * (local_3f8 < 0x100) *
                                                  (char)(uVar98 >> 8) - (0xff < local_3f8))))))) &
           0xff00ff00ff00ff;
  local_918 = (ushort)uVar82;
  uStack_916 = (ushort)(uVar82 >> 0x10);
  uStack_914 = (ushort)(uVar82 >> 0x20);
  uStack_912 = (ushort)(uVar82 >> 0x30);
  uStack_910 = (ushort)uVar83;
  uStack_90e = (ushort)(uVar83 >> 0x10);
  uStack_90c = (ushort)(uVar83 >> 0x20);
  uStack_90a = (ushort)(uVar83 >> 0x30);
  local_928 = (ushort)uVar85;
  uStack_926 = (ushort)(uVar85 >> 0x10);
  uStack_924 = (ushort)(uVar85 >> 0x20);
  uStack_922 = (ushort)(uVar85 >> 0x30);
  uStack_920 = (ushort)uVar90;
  uStack_91e = (ushort)(uVar90 >> 0x10);
  uStack_91c = (ushort)(uVar90 >> 0x20);
  uStack_91a = (ushort)(uVar90 >> 0x30);
  *(char *)in_RSI = (local_918 != 0) * (local_918 < 0x100) * (char)uVar82 - (0xff < local_918);
  *(char *)((long)in_RSI + 1) =
       (uStack_916 != 0) * (uStack_916 < 0x100) * (char)(uVar82 >> 0x10) - (0xff < uStack_916);
  *(char *)((long)in_RSI + 2) =
       (uStack_914 != 0) * (uStack_914 < 0x100) * (char)(uVar82 >> 0x20) - (0xff < uStack_914);
  *(char *)((long)in_RSI + 3) =
       (uStack_912 != 0) * (uStack_912 < 0x100) * (char)(uVar82 >> 0x30) - (0xff < uStack_912);
  *(char *)((long)in_RSI + 4) =
       (uStack_910 != 0) * (uStack_910 < 0x100) * (char)uVar83 - (0xff < uStack_910);
  *(char *)((long)in_RSI + 5) =
       (uStack_90e != 0) * (uStack_90e < 0x100) * (char)(uVar83 >> 0x10) - (0xff < uStack_90e);
  *(char *)((long)in_RSI + 6) =
       (uStack_90c != 0) * (uStack_90c < 0x100) * (char)(uVar83 >> 0x20) - (0xff < uStack_90c);
  *(char *)((long)in_RSI + 7) =
       (uStack_90a != 0) * (uStack_90a < 0x100) * (char)(uVar83 >> 0x30) - (0xff < uStack_90a);
  *(char *)(in_RSI + 1) = (local_928 != 0) * (local_928 < 0x100) * (char)uVar85 - (0xff < local_928)
  ;
  *(char *)((long)in_RSI + 9) =
       (uStack_926 != 0) * (uStack_926 < 0x100) * (char)(uVar85 >> 0x10) - (0xff < uStack_926);
  *(char *)((long)in_RSI + 10) =
       (uStack_924 != 0) * (uStack_924 < 0x100) * (char)(uVar85 >> 0x20) - (0xff < uStack_924);
  *(char *)((long)in_RSI + 0xb) =
       (uStack_922 != 0) * (uStack_922 < 0x100) * (char)(uVar85 >> 0x30) - (0xff < uStack_922);
  *(char *)((long)in_RSI + 0xc) =
       (uStack_920 != 0) * (uStack_920 < 0x100) * (char)uVar90 - (0xff < uStack_920);
  *(char *)((long)in_RSI + 0xd) =
       (uStack_91e != 0) * (uStack_91e < 0x100) * (char)(uVar90 >> 0x10) - (0xff < uStack_91e);
  *(char *)((long)in_RSI + 0xe) =
       (uStack_91c != 0) * (uStack_91c < 0x100) * (char)(uVar90 >> 0x20) - (0xff < uStack_91c);
  *(char *)((long)in_RSI + 0xf) =
       (uStack_91a != 0) * (uStack_91a < 0x100) * (char)(uVar90 >> 0x30) - (0xff < uStack_91a);
  uVar98 = (ulong)CONCAT16((uStack_40c != 0) * (uStack_40c < 0x100) * (char)(uVar99 >> 0x28) -
                           (0xff < uStack_40c),
                           CONCAT15(bVar35,CONCAT14((uStack_410 != 0) * (uStack_410 < 0x100) *
                                                    (char)(uVar99 >> 8) - (0xff < uStack_410),
                                                    CONCAT13(bVar34,CONCAT12((uStack_414 != 0) *
                                                                             (uStack_414 < 0x100) *
                                                                             (char)(uVar91 >> 0x28)
                                                                             - (0xff < uStack_414),
                                                                             CONCAT11(bVar33,(
                                                  local_418 != 0) * (local_418 < 0x100) *
                                                  (char)(uVar91 >> 8) - (0xff < local_418))))))) &
           0xff00ff00ff00ff;
  uVar110 = (ulong)CONCAT16((uStack_42c != 0) * (uStack_42c < 0x100) * (char)(uVar111 >> 0x28) -
                            (0xff < uStack_42c),
                            CONCAT15(bVar39,CONCAT14((uStack_430 != 0) * (uStack_430 < 0x100) *
                                                     (char)(uVar111 >> 8) - (0xff < uStack_430),
                                                     CONCAT13(bVar38,CONCAT12((uStack_434 != 0) *
                                                                              (uStack_434 < 0x100) *
                                                                              (char)(uVar100 >> 0x28
                                                                                    ) - (0xff < 
                                                  uStack_434),
                                                  CONCAT11(bVar37,(local_438 != 0) *
                                                                  (local_438 < 0x100) *
                                                                  (char)(uVar100 >> 8) -
                                                                  (0xff < local_438))))))) &
            0xff00ff00ff00ff;
  uVar85 = (ulong)CONCAT16((uStack_44c != 0) * (uStack_44c < 0x100) * (char)(uVar79 >> 0x28) -
                           (0xff < uStack_44c),
                           CONCAT15(bVar43,CONCAT14((uStack_450 != 0) * (uStack_450 < 0x100) *
                                                    (char)(uVar79 >> 8) - (0xff < uStack_450),
                                                    CONCAT13(bVar42,CONCAT12((uStack_454 != 0) *
                                                                             (uStack_454 < 0x100) *
                                                                             (char)(uVar112 >> 0x28)
                                                                             - (0xff < uStack_454),
                                                                             CONCAT11(bVar41,(
                                                  local_458 != 0) * (local_458 < 0x100) *
                                                  (char)(uVar112 >> 8) - (0xff < local_458))))))) &
           0xff00ff00ff00ff;
  uVar90 = (ulong)CONCAT16((uStack_46c != 0) * (uStack_46c < 0x100) * (char)(uVar81 >> 0x28) -
                           (0xff < uStack_46c),
                           CONCAT15(bVar47,CONCAT14((uStack_470 != 0) * (uStack_470 < 0x100) *
                                                    (char)(uVar81 >> 8) - (0xff < uStack_470),
                                                    CONCAT13(bVar46,CONCAT12((uStack_474 != 0) *
                                                                             (uStack_474 < 0x100) *
                                                                             (char)(uVar80 >> 0x28)
                                                                             - (0xff < uStack_474),
                                                                             CONCAT11(bVar45,(
                                                  local_478 != 0) * (local_478 < 0x100) *
                                                  (char)(uVar80 >> 8) - (0xff < local_478))))))) &
           0xff00ff00ff00ff;
  local_938 = (ushort)uVar98;
  uStack_936 = (ushort)(uVar98 >> 0x10);
  uStack_934 = (ushort)(uVar98 >> 0x20);
  uStack_932 = (ushort)(uVar98 >> 0x30);
  uStack_930 = (ushort)uVar110;
  uStack_92e = (ushort)(uVar110 >> 0x10);
  uStack_92c = (ushort)(uVar110 >> 0x20);
  uStack_92a = (ushort)(uVar110 >> 0x30);
  local_948 = (ushort)uVar85;
  uStack_946 = (ushort)(uVar85 >> 0x10);
  uStack_944 = (ushort)(uVar85 >> 0x20);
  uStack_942 = (ushort)(uVar85 >> 0x30);
  uStack_940 = (ushort)uVar90;
  uStack_93e = (ushort)(uVar90 >> 0x10);
  uStack_93c = (ushort)(uVar90 >> 0x20);
  uStack_93a = (ushort)(uVar90 >> 0x30);
  *(char *)in_RDX = (local_938 != 0) * (local_938 < 0x100) * (char)uVar98 - (0xff < local_938);
  *(char *)((long)in_RDX + 1) =
       (uStack_936 != 0) * (uStack_936 < 0x100) * (char)(uVar98 >> 0x10) - (0xff < uStack_936);
  *(char *)((long)in_RDX + 2) =
       (uStack_934 != 0) * (uStack_934 < 0x100) * (char)(uVar98 >> 0x20) - (0xff < uStack_934);
  *(char *)((long)in_RDX + 3) =
       (uStack_932 != 0) * (uStack_932 < 0x100) * (char)(uVar98 >> 0x30) - (0xff < uStack_932);
  *(char *)((long)in_RDX + 4) =
       (uStack_930 != 0) * (uStack_930 < 0x100) * (char)uVar110 - (0xff < uStack_930);
  *(char *)((long)in_RDX + 5) =
       (uStack_92e != 0) * (uStack_92e < 0x100) * (char)(uVar110 >> 0x10) - (0xff < uStack_92e);
  *(char *)((long)in_RDX + 6) =
       (uStack_92c != 0) * (uStack_92c < 0x100) * (char)(uVar110 >> 0x20) - (0xff < uStack_92c);
  *(char *)((long)in_RDX + 7) =
       (uStack_92a != 0) * (uStack_92a < 0x100) * (char)(uVar110 >> 0x30) - (0xff < uStack_92a);
  *(char *)(in_RDX + 1) = (local_948 != 0) * (local_948 < 0x100) * (char)uVar85 - (0xff < local_948)
  ;
  *(char *)((long)in_RDX + 9) =
       (uStack_946 != 0) * (uStack_946 < 0x100) * (char)(uVar85 >> 0x10) - (0xff < uStack_946);
  *(char *)((long)in_RDX + 10) =
       (uStack_944 != 0) * (uStack_944 < 0x100) * (char)(uVar85 >> 0x20) - (0xff < uStack_944);
  *(char *)((long)in_RDX + 0xb) =
       (uStack_942 != 0) * (uStack_942 < 0x100) * (char)(uVar85 >> 0x30) - (0xff < uStack_942);
  *(char *)((long)in_RDX + 0xc) =
       (uStack_940 != 0) * (uStack_940 < 0x100) * (char)uVar90 - (0xff < uStack_940);
  *(char *)((long)in_RDX + 0xd) =
       (uStack_93e != 0) * (uStack_93e < 0x100) * (char)(uVar90 >> 0x10) - (0xff < uStack_93e);
  *(char *)((long)in_RDX + 0xe) =
       (uStack_93c != 0) * (uStack_93c < 0x100) * (char)(uVar90 >> 0x20) - (0xff < uStack_93c);
  *(char *)((long)in_RDX + 0xf) =
       (uStack_93a != 0) * (uStack_93a < 0x100) * (char)(uVar90 >> 0x30) - (0xff < uStack_93a);
  uVar101 = (ushort)(((uint)bVar2 << 0x18) >> 0x18);
  uVar102 = (ushort)(((uint6)bVar3 << 0x28) >> 0x28);
  uVar105 = (ushort)(((ulong)bVar4 << 0x38) >> 0x38);
  uVar113 = (ushort)(((uint)bVar6 << 0x18) >> 0x18);
  uVar115 = (ushort)(((uint6)bVar7 << 0x28) >> 0x28);
  uVar120 = (ushort)(((ulong)bVar8 << 0x38) >> 0x38);
  uVar86 = (ushort)(((uint)bVar10 << 0x18) >> 0x18);
  uVar93 = (ushort)(((uint6)bVar11 << 0x28) >> 0x28);
  uVar104 = (ushort)(((ulong)bVar12 << 0x38) >> 0x38);
  uVar119 = (ushort)(((uint)bVar14 << 0x18) >> 0x18);
  uVar92 = (ushort)(((uint6)bVar15 << 0x28) >> 0x28);
  uVar94 = (ushort)(((ulong)bVar16 << 0x38) >> 0x38);
  *(byte *)in_RCX = (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1);
  *(byte *)((long)in_RCX + 1) = (uVar101 != 0) * (uVar101 < 0x100) * bVar2 - (0xff < uVar101);
  *(byte *)((long)in_RCX + 2) = (uVar102 != 0) * (uVar102 < 0x100) * bVar3 - (0xff < uVar102);
  *(byte *)((long)in_RCX + 3) = (uVar105 != 0) * (uVar105 < 0x100) * bVar4 - (0xff < uVar105);
  *(byte *)((long)in_RCX + 4) = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
  *(byte *)((long)in_RCX + 5) = (uVar113 != 0) * (uVar113 < 0x100) * bVar6 - (0xff < uVar113);
  *(byte *)((long)in_RCX + 6) = (uVar115 != 0) * (uVar115 < 0x100) * bVar7 - (0xff < uVar115);
  *(byte *)((long)in_RCX + 7) = (uVar120 != 0) * (uVar120 < 0x100) * bVar8 - (0xff < uVar120);
  *(byte *)(in_RCX + 1) = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
  *(byte *)((long)in_RCX + 9) = (uVar86 != 0) * (uVar86 < 0x100) * bVar10 - (0xff < uVar86);
  *(byte *)((long)in_RCX + 10) = (uVar93 != 0) * (uVar93 < 0x100) * bVar11 - (0xff < uVar93);
  *(byte *)((long)in_RCX + 0xb) = (uVar104 != 0) * (uVar104 < 0x100) * bVar12 - (0xff < uVar104);
  *(byte *)((long)in_RCX + 0xc) = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
  *(byte *)((long)in_RCX + 0xd) = (uVar119 != 0) * (uVar119 < 0x100) * bVar14 - (0xff < uVar119);
  *(byte *)((long)in_RCX + 0xe) = (uVar92 != 0) * (uVar92 < 0x100) * bVar15 - (0xff < uVar92);
  *(byte *)((long)in_RCX + 0xf) = (uVar94 != 0) * (uVar94 < 0x100) * bVar16 - (0xff < uVar94);
  uVar101 = (ushort)(((uint)bVar18 << 0x18) >> 0x18);
  uVar102 = (ushort)(((uint6)bVar19 << 0x28) >> 0x28);
  uVar105 = (ushort)(((ulong)bVar20 << 0x38) >> 0x38);
  uVar113 = (ushort)(((uint)bVar22 << 0x18) >> 0x18);
  uVar115 = (ushort)(((uint6)bVar23 << 0x28) >> 0x28);
  uVar120 = (ushort)(((ulong)bVar24 << 0x38) >> 0x38);
  uVar86 = (ushort)(((uint)bVar26 << 0x18) >> 0x18);
  uVar93 = (ushort)(((uint6)bVar27 << 0x28) >> 0x28);
  uVar104 = (ushort)(((ulong)bVar28 << 0x38) >> 0x38);
  uVar119 = (ushort)(((uint)bVar30 << 0x18) >> 0x18);
  uVar92 = (ushort)(((uint6)bVar31 << 0x28) >> 0x28);
  uVar94 = (ushort)(((ulong)bVar32 << 0x38) >> 0x38);
  *(byte *)in_R8 = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
  *(byte *)((long)in_R8 + 1) = (uVar101 != 0) * (uVar101 < 0x100) * bVar18 - (0xff < uVar101);
  *(byte *)((long)in_R8 + 2) = (uVar102 != 0) * (uVar102 < 0x100) * bVar19 - (0xff < uVar102);
  *(byte *)((long)in_R8 + 3) = (uVar105 != 0) * (uVar105 < 0x100) * bVar20 - (0xff < uVar105);
  *(byte *)((long)in_R8 + 4) = (bVar21 != 0) * (bVar21 < 0x100) * bVar21 - (0xff < bVar21);
  *(byte *)((long)in_R8 + 5) = (uVar113 != 0) * (uVar113 < 0x100) * bVar22 - (0xff < uVar113);
  *(byte *)((long)in_R8 + 6) = (uVar115 != 0) * (uVar115 < 0x100) * bVar23 - (0xff < uVar115);
  *(byte *)((long)in_R8 + 7) = (uVar120 != 0) * (uVar120 < 0x100) * bVar24 - (0xff < uVar120);
  *(byte *)(in_R8 + 1) = (bVar25 != 0) * (bVar25 < 0x100) * bVar25 - (0xff < bVar25);
  *(byte *)((long)in_R8 + 9) = (uVar86 != 0) * (uVar86 < 0x100) * bVar26 - (0xff < uVar86);
  *(byte *)((long)in_R8 + 10) = (uVar93 != 0) * (uVar93 < 0x100) * bVar27 - (0xff < uVar93);
  *(byte *)((long)in_R8 + 0xb) = (uVar104 != 0) * (uVar104 < 0x100) * bVar28 - (0xff < uVar104);
  *(byte *)((long)in_R8 + 0xc) = (bVar29 != 0) * (bVar29 < 0x100) * bVar29 - (0xff < bVar29);
  *(byte *)((long)in_R8 + 0xd) = (uVar119 != 0) * (uVar119 < 0x100) * bVar30 - (0xff < uVar119);
  *(byte *)((long)in_R8 + 0xe) = (uVar92 != 0) * (uVar92 < 0x100) * bVar31 - (0xff < uVar92);
  *(byte *)((long)in_R8 + 0xf) = (uVar94 != 0) * (uVar94 < 0x100) * bVar32 - (0xff < uVar94);
  uVar101 = (ushort)(((uint)bVar34 << 0x18) >> 0x18);
  uVar102 = (ushort)(((uint6)bVar35 << 0x28) >> 0x28);
  uVar105 = (ushort)(((ulong)bVar36 << 0x38) >> 0x38);
  uVar113 = (ushort)(((uint)bVar38 << 0x18) >> 0x18);
  uVar115 = (ushort)(((uint6)bVar39 << 0x28) >> 0x28);
  uVar120 = (ushort)(((ulong)bVar40 << 0x38) >> 0x38);
  uVar86 = (ushort)(((uint)bVar42 << 0x18) >> 0x18);
  uVar93 = (ushort)(((uint6)bVar43 << 0x28) >> 0x28);
  uVar104 = (ushort)(((ulong)bVar44 << 0x38) >> 0x38);
  uVar119 = (ushort)(((uint)bVar46 << 0x18) >> 0x18);
  uVar92 = (ushort)(((uint6)bVar47 << 0x28) >> 0x28);
  uVar94 = (ushort)(((ulong)bVar48 << 0x38) >> 0x38);
  *(byte *)in_R9 = (bVar33 != 0) * (bVar33 < 0x100) * bVar33 - (0xff < bVar33);
  *(byte *)((long)in_R9 + 1) = (uVar101 != 0) * (uVar101 < 0x100) * bVar34 - (0xff < uVar101);
  *(byte *)((long)in_R9 + 2) = (uVar102 != 0) * (uVar102 < 0x100) * bVar35 - (0xff < uVar102);
  *(byte *)((long)in_R9 + 3) = (uVar105 != 0) * (uVar105 < 0x100) * bVar36 - (0xff < uVar105);
  *(byte *)((long)in_R9 + 4) = (bVar37 != 0) * (bVar37 < 0x100) * bVar37 - (0xff < bVar37);
  *(byte *)((long)in_R9 + 5) = (uVar113 != 0) * (uVar113 < 0x100) * bVar38 - (0xff < uVar113);
  *(byte *)((long)in_R9 + 6) = (uVar115 != 0) * (uVar115 < 0x100) * bVar39 - (0xff < uVar115);
  *(byte *)((long)in_R9 + 7) = (uVar120 != 0) * (uVar120 < 0x100) * bVar40 - (0xff < uVar120);
  *(byte *)(in_R9 + 1) = (bVar41 != 0) * (bVar41 < 0x100) * bVar41 - (0xff < bVar41);
  *(byte *)((long)in_R9 + 9) = (uVar86 != 0) * (uVar86 < 0x100) * bVar42 - (0xff < uVar86);
  *(byte *)((long)in_R9 + 10) = (uVar93 != 0) * (uVar93 < 0x100) * bVar43 - (0xff < uVar93);
  *(byte *)((long)in_R9 + 0xb) = (uVar104 != 0) * (uVar104 < 0x100) * bVar44 - (0xff < uVar104);
  *(byte *)((long)in_R9 + 0xc) = (bVar45 != 0) * (bVar45 < 0x100) * bVar45 - (0xff < bVar45);
  *(byte *)((long)in_R9 + 0xd) = (uVar119 != 0) * (uVar119 < 0x100) * bVar46 - (0xff < uVar119);
  *(byte *)((long)in_R9 + 0xe) = (uVar92 != 0) * (uVar92 < 0x100) * bVar47 - (0xff < uVar92);
  *(byte *)((long)in_R9 + 0xf) = (uVar94 != 0) * (uVar94 < 0x100) * bVar48 - (0xff < uVar94);
  uVar95 = *in_RDI & 0xff00ff00ff00ff;
  uVar107 = in_RDI[1] & 0xff00ff00ff00ff;
  uVar82 = *in_RSI & 0xff00ff00ff00ff;
  uVar87 = in_RSI[1] & 0xff00ff00ff00ff;
  local_9b8 = (ushort)uVar95;
  uStack_9b6 = (ushort)(uVar95 >> 0x10);
  uStack_9b4 = (ushort)(uVar95 >> 0x20);
  uStack_9b2 = (ushort)(uVar95 >> 0x30);
  uStack_9b0 = (ushort)uVar107;
  uStack_9ae = (ushort)(uVar107 >> 0x10);
  uStack_9ac = (ushort)(uVar107 >> 0x20);
  uStack_9aa = (ushort)(uVar107 >> 0x30);
  local_9c8 = (ushort)uVar82;
  uStack_9c6 = (ushort)(uVar82 >> 0x10);
  uStack_9c4 = (ushort)(uVar82 >> 0x20);
  uStack_9c2 = (ushort)(uVar82 >> 0x30);
  uStack_9c0 = (ushort)uVar87;
  uStack_9be = (ushort)(uVar87 >> 0x10);
  uStack_9bc = (ushort)(uVar87 >> 0x20);
  uStack_9ba = (ushort)(uVar87 >> 0x30);
  bVar2 = (uStack_9b6 != 0) * (uStack_9b6 < 0x100) * (char)(uVar95 >> 0x10) - (0xff < uStack_9b6);
  bVar1 = (uStack_9b2 != 0) * (uStack_9b2 < 0x100) * (char)(uVar95 >> 0x30) - (0xff < uStack_9b2);
  bVar8 = (uStack_9ae != 0) * (uStack_9ae < 0x100) * (char)(uVar107 >> 0x10) - (0xff < uStack_9ae);
  bVar7 = (uStack_9aa != 0) * (uStack_9aa < 0x100) * (char)(uVar107 >> 0x30) - (0xff < uStack_9aa);
  bVar6 = (uStack_9c6 != 0) * (uStack_9c6 < 0x100) * (char)(uVar82 >> 0x10) - (0xff < uStack_9c6);
  bVar5 = (uStack_9c2 != 0) * (uStack_9c2 < 0x100) * (char)(uVar82 >> 0x30) - (0xff < uStack_9c2);
  bVar4 = (uStack_9be != 0) * (uStack_9be < 0x100) * (char)(uVar87 >> 0x10) - (0xff < uStack_9be);
  bVar3 = (uStack_9ba != 0) * (uStack_9ba < 0x100) * (char)(uVar87 >> 0x30) - (0xff < uStack_9ba);
  uVar96 = *in_RDX & 0xff00ff00ff00ff;
  uVar108 = in_RDX[1] & 0xff00ff00ff00ff;
  uVar83 = *in_RCX & 0xff00ff00ff00ff;
  uVar88 = in_RCX[1] & 0xff00ff00ff00ff;
  local_9d8 = (ushort)uVar96;
  uStack_9d6 = (ushort)(uVar96 >> 0x10);
  uStack_9d4 = (ushort)(uVar96 >> 0x20);
  uStack_9d2 = (ushort)(uVar96 >> 0x30);
  uStack_9d0 = (ushort)uVar108;
  uStack_9ce = (ushort)(uVar108 >> 0x10);
  uStack_9cc = (ushort)(uVar108 >> 0x20);
  uStack_9ca = (ushort)(uVar108 >> 0x30);
  local_9e8 = (ushort)uVar83;
  uStack_9e6 = (ushort)(uVar83 >> 0x10);
  uStack_9e4 = (ushort)(uVar83 >> 0x20);
  uStack_9e2 = (ushort)(uVar83 >> 0x30);
  uStack_9e0 = (ushort)uVar88;
  uStack_9de = (ushort)(uVar88 >> 0x10);
  uStack_9dc = (ushort)(uVar88 >> 0x20);
  uStack_9da = (ushort)(uVar88 >> 0x30);
  bVar11 = (uStack_9d6 != 0) * (uStack_9d6 < 0x100) * (char)(uVar96 >> 0x10) - (0xff < uStack_9d6);
  bVar9 = (uStack_9d2 != 0) * (uStack_9d2 < 0x100) * (char)(uVar96 >> 0x30) - (0xff < uStack_9d2);
  bVar10 = (uStack_9ce != 0) * (uStack_9ce < 0x100) * (char)(uVar108 >> 0x10) - (0xff < uStack_9ce);
  bVar12 = (uStack_9ca != 0) * (uStack_9ca < 0x100) * (char)(uVar108 >> 0x30) - (0xff < uStack_9ca);
  bVar13 = (uStack_9e6 != 0) * (uStack_9e6 < 0x100) * (char)(uVar83 >> 0x10) - (0xff < uStack_9e6);
  bVar14 = (uStack_9e2 != 0) * (uStack_9e2 < 0x100) * (char)(uVar83 >> 0x30) - (0xff < uStack_9e2);
  bVar15 = (uStack_9de != 0) * (uStack_9de < 0x100) * (char)(uVar88 >> 0x10) - (0xff < uStack_9de);
  bVar16 = (uStack_9da != 0) * (uStack_9da < 0x100) * (char)(uVar88 >> 0x30) - (0xff < uStack_9da);
  uVar97 = *in_R8 & 0xff00ff00ff00ff;
  uVar109 = in_R8[1] & 0xff00ff00ff00ff;
  uVar84 = *in_R9 & 0xff00ff00ff00ff;
  uVar89 = in_R9[1] & 0xff00ff00ff00ff;
  local_9f8 = (ushort)uVar97;
  uStack_9f6 = (ushort)(uVar97 >> 0x10);
  uStack_9f4 = (ushort)(uVar97 >> 0x20);
  uStack_9f2 = (ushort)(uVar97 >> 0x30);
  uStack_9f0 = (ushort)uVar109;
  uStack_9ee = (ushort)(uVar109 >> 0x10);
  uStack_9ec = (ushort)(uVar109 >> 0x20);
  uStack_9ea = (ushort)(uVar109 >> 0x30);
  local_a08 = (ushort)uVar84;
  uStack_a06 = (ushort)(uVar84 >> 0x10);
  uStack_a04 = (ushort)(uVar84 >> 0x20);
  uStack_a02 = (ushort)(uVar84 >> 0x30);
  uStack_a00 = (ushort)uVar89;
  uStack_9fe = (ushort)(uVar89 >> 0x10);
  uStack_9fc = (ushort)(uVar89 >> 0x20);
  uStack_9fa = (ushort)(uVar89 >> 0x30);
  bVar19 = (uStack_9f6 != 0) * (uStack_9f6 < 0x100) * (char)(uVar97 >> 0x10) - (0xff < uStack_9f6);
  bVar24 = (uStack_9f2 != 0) * (uStack_9f2 < 0x100) * (char)(uVar97 >> 0x30) - (0xff < uStack_9f2);
  bVar23 = (uStack_9ee != 0) * (uStack_9ee < 0x100) * (char)(uVar109 >> 0x10) - (0xff < uStack_9ee);
  bVar22 = (uStack_9ea != 0) * (uStack_9ea < 0x100) * (char)(uVar109 >> 0x30) - (0xff < uStack_9ea);
  bVar21 = (uStack_a06 != 0) * (uStack_a06 < 0x100) * (char)(uVar84 >> 0x10) - (0xff < uStack_a06);
  bVar20 = (uStack_a02 != 0) * (uStack_a02 < 0x100) * (char)(uVar84 >> 0x30) - (0xff < uStack_a02);
  bVar18 = (uStack_9fe != 0) * (uStack_9fe < 0x100) * (char)(uVar89 >> 0x10) - (0xff < uStack_9fe);
  bVar17 = (uStack_9fa != 0) * (uStack_9fa < 0x100) * (char)(uVar89 >> 0x30) - (0xff < uStack_9fa);
  uVar85 = *in_RDI;
  uVar90 = in_RDI[1];
  local_558 = (ushort)uVar85;
  uStack_556 = (ushort)(uVar85 >> 0x10);
  uStack_554 = (ushort)(uVar85 >> 0x20);
  uStack_550 = (ushort)uVar90;
  uStack_54e = (ushort)(uVar90 >> 0x10);
  uStack_54c = (ushort)(uVar90 >> 0x20);
  local_558 = local_558 >> 8;
  uStack_556 = uStack_556 >> 8;
  uStack_554 = uStack_554 >> 8;
  uVar104 = (ushort)(uVar85 >> 0x38);
  uStack_550 = uStack_550 >> 8;
  uStack_54e = uStack_54e >> 8;
  uStack_54c = uStack_54c >> 8;
  uVar119 = (ushort)(uVar90 >> 0x38);
  uVar98 = *in_RSI;
  uVar110 = in_RSI[1];
  local_578 = (ushort)uVar98;
  uStack_576 = (ushort)(uVar98 >> 0x10);
  uStack_574 = (ushort)(uVar98 >> 0x20);
  uStack_570 = (ushort)uVar110;
  uStack_56e = (ushort)(uVar110 >> 0x10);
  uStack_56c = (ushort)(uVar110 >> 0x20);
  local_578 = local_578 >> 8;
  uStack_576 = uStack_576 >> 8;
  uStack_574 = uStack_574 >> 8;
  uVar86 = (ushort)(uVar98 >> 0x38);
  uStack_570 = uStack_570 >> 8;
  uStack_56e = uStack_56e >> 8;
  uStack_56c = uStack_56c >> 8;
  uVar93 = (ushort)(uVar110 >> 0x38);
  bVar25 = (uStack_556 != 0) * (uStack_556 < 0x100) * (char)(uVar85 >> 0x18) - (0xff < uStack_556);
  bVar31 = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar85 >> 0x38) - (0xff < uVar104);
  bVar30 = (uStack_54e != 0) * (uStack_54e < 0x100) * (char)(uVar90 >> 0x18) - (0xff < uStack_54e);
  bVar29 = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar90 >> 0x38) - (0xff < uVar119);
  bVar32 = (uStack_576 != 0) * (uStack_576 < 0x100) * (char)(uVar98 >> 0x18) - (0xff < uStack_576);
  bVar28 = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar98 >> 0x38) - (0xff < uVar86);
  bVar27 = (uStack_56e != 0) * (uStack_56e < 0x100) * (char)(uVar110 >> 0x18) - (0xff < uStack_56e);
  bVar26 = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar110 >> 0x38) - (0xff < uVar93);
  uVar91 = *in_RDX;
  uVar99 = in_RDX[1];
  local_598 = (ushort)uVar91;
  uStack_596 = (ushort)(uVar91 >> 0x10);
  uStack_594 = (ushort)(uVar91 >> 0x20);
  uStack_590 = (ushort)uVar99;
  uStack_58e = (ushort)(uVar99 >> 0x10);
  uStack_58c = (ushort)(uVar99 >> 0x20);
  local_598 = local_598 >> 8;
  uStack_596 = uStack_596 >> 8;
  uStack_594 = uStack_594 >> 8;
  uVar104 = (ushort)(uVar91 >> 0x38);
  uStack_590 = uStack_590 >> 8;
  uStack_58e = uStack_58e >> 8;
  uStack_58c = uStack_58c >> 8;
  uVar119 = (ushort)(uVar99 >> 0x38);
  uVar100 = *in_RCX;
  uVar111 = in_RCX[1];
  local_5b8 = (ushort)uVar100;
  uStack_5b6 = (ushort)(uVar100 >> 0x10);
  uStack_5b4 = (ushort)(uVar100 >> 0x20);
  uStack_5b0 = (ushort)uVar111;
  uStack_5ae = (ushort)(uVar111 >> 0x10);
  uStack_5ac = (ushort)(uVar111 >> 0x20);
  local_5b8 = local_5b8 >> 8;
  uStack_5b6 = uStack_5b6 >> 8;
  uStack_5b4 = uStack_5b4 >> 8;
  uVar86 = (ushort)(uVar100 >> 0x38);
  uStack_5b0 = uStack_5b0 >> 8;
  uStack_5ae = uStack_5ae >> 8;
  uStack_5ac = uStack_5ac >> 8;
  uVar93 = (ushort)(uVar111 >> 0x38);
  bVar39 = (uStack_596 != 0) * (uStack_596 < 0x100) * (char)(uVar91 >> 0x18) - (0xff < uStack_596);
  bVar40 = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar91 >> 0x38) - (0xff < uVar104);
  bVar38 = (uStack_58e != 0) * (uStack_58e < 0x100) * (char)(uVar99 >> 0x18) - (0xff < uStack_58e);
  bVar37 = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar99 >> 0x38) - (0xff < uVar119);
  bVar35 = (uStack_5b6 != 0) * (uStack_5b6 < 0x100) * (char)(uVar100 >> 0x18) - (0xff < uStack_5b6);
  bVar33 = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar100 >> 0x38) - (0xff < uVar86);
  bVar34 = (uStack_5ae != 0) * (uStack_5ae < 0x100) * (char)(uVar111 >> 0x18) - (0xff < uStack_5ae);
  bVar36 = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar111 >> 0x38) - (0xff < uVar93);
  uVar112 = *in_R8;
  uVar79 = in_R8[1];
  local_5d8 = (ushort)uVar112;
  uStack_5d6 = (ushort)(uVar112 >> 0x10);
  uStack_5d4 = (ushort)(uVar112 >> 0x20);
  uStack_5d0 = (ushort)uVar79;
  uStack_5ce = (ushort)(uVar79 >> 0x10);
  uStack_5cc = (ushort)(uVar79 >> 0x20);
  local_5d8 = local_5d8 >> 8;
  uStack_5d6 = uStack_5d6 >> 8;
  uStack_5d4 = uStack_5d4 >> 8;
  uVar104 = (ushort)(uVar112 >> 0x38);
  uStack_5d0 = uStack_5d0 >> 8;
  uStack_5ce = uStack_5ce >> 8;
  uStack_5cc = uStack_5cc >> 8;
  uVar119 = (ushort)(uVar79 >> 0x38);
  uVar80 = *in_R9;
  uVar81 = in_R9[1];
  local_5f8 = (ushort)uVar80;
  uStack_5f6 = (ushort)(uVar80 >> 0x10);
  uStack_5f4 = (ushort)(uVar80 >> 0x20);
  uStack_5f0 = (ushort)uVar81;
  uStack_5ee = (ushort)(uVar81 >> 0x10);
  uStack_5ec = (ushort)(uVar81 >> 0x20);
  local_5f8 = local_5f8 >> 8;
  uStack_5f6 = uStack_5f6 >> 8;
  uStack_5f4 = uStack_5f4 >> 8;
  uVar86 = (ushort)(uVar80 >> 0x38);
  uStack_5f0 = uStack_5f0 >> 8;
  uStack_5ee = uStack_5ee >> 8;
  uStack_5ec = uStack_5ec >> 8;
  uVar93 = (ushort)(uVar81 >> 0x38);
  bVar48 = (uStack_5d6 != 0) * (uStack_5d6 < 0x100) * (char)(uVar112 >> 0x18) - (0xff < uStack_5d6);
  bVar47 = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar112 >> 0x38) - (0xff < uVar104);
  bVar46 = (uStack_5ce != 0) * (uStack_5ce < 0x100) * (char)(uVar79 >> 0x18) - (0xff < uStack_5ce);
  bVar45 = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar79 >> 0x38) - (0xff < uVar119);
  bVar41 = (uStack_5f6 != 0) * (uStack_5f6 < 0x100) * (char)(uVar80 >> 0x18) - (0xff < uStack_5f6);
  bVar44 = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar80 >> 0x38) - (0xff < uVar86);
  bVar43 = (uStack_5ee != 0) * (uStack_5ee < 0x100) * (char)(uVar81 >> 0x18) - (0xff < uStack_5ee);
  bVar42 = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar81 >> 0x38) - (0xff < uVar93);
  uVar95 = (ulong)CONCAT16((uStack_9ac != 0) * (uStack_9ac < 0x100) * (char)(uVar107 >> 0x20) -
                           (0xff < uStack_9ac),
                           CONCAT15(bVar8,CONCAT14((uStack_9b0 != 0) * (uStack_9b0 < 0x100) *
                                                   (char)uVar107 - (0xff < uStack_9b0),
                                                   CONCAT13(bVar1,CONCAT12((uStack_9b4 != 0) *
                                                                           (uStack_9b4 < 0x100) *
                                                                           (char)(uVar95 >> 0x20) -
                                                                           (0xff < uStack_9b4),
                                                                           CONCAT11(bVar2,(local_9b8
                                                                                          != 0) * (
                                                  local_9b8 < 0x100) * (char)uVar95 -
                                                  (0xff < local_9b8))))))) & 0xff00ff00ff00ff;
  uVar107 = (ulong)CONCAT16((uStack_9bc != 0) * (uStack_9bc < 0x100) * (char)(uVar87 >> 0x20) -
                            (0xff < uStack_9bc),
                            CONCAT15(bVar4,CONCAT14((uStack_9c0 != 0) * (uStack_9c0 < 0x100) *
                                                    (char)uVar87 - (0xff < uStack_9c0),
                                                    CONCAT13(bVar5,CONCAT12((uStack_9c4 != 0) *
                                                                            (uStack_9c4 < 0x100) *
                                                                            (char)(uVar82 >> 0x20) -
                                                                            (0xff < uStack_9c4),
                                                                            CONCAT11(bVar6,(
                                                  local_9c8 != 0) * (local_9c8 < 0x100) *
                                                  (char)uVar82 - (0xff < local_9c8))))))) &
            0xff00ff00ff00ff;
  uVar82 = (ulong)CONCAT16((uStack_9cc != 0) * (uStack_9cc < 0x100) * (char)(uVar108 >> 0x20) -
                           (0xff < uStack_9cc),
                           CONCAT15(bVar10,CONCAT14((uStack_9d0 != 0) * (uStack_9d0 < 0x100) *
                                                    (char)uVar108 - (0xff < uStack_9d0),
                                                    CONCAT13(bVar9,CONCAT12((uStack_9d4 != 0) *
                                                                            (uStack_9d4 < 0x100) *
                                                                            (char)(uVar96 >> 0x20) -
                                                                            (0xff < uStack_9d4),
                                                                            CONCAT11(bVar11,(
                                                  local_9d8 != 0) * (local_9d8 < 0x100) *
                                                  (char)uVar96 - (0xff < local_9d8))))))) &
           0xff00ff00ff00ff;
  uVar83 = (ulong)CONCAT16((uStack_9dc != 0) * (uStack_9dc < 0x100) * (char)(uVar88 >> 0x20) -
                           (0xff < uStack_9dc),
                           CONCAT15(bVar15,CONCAT14((uStack_9e0 != 0) * (uStack_9e0 < 0x100) *
                                                    (char)uVar88 - (0xff < uStack_9e0),
                                                    CONCAT13(bVar14,CONCAT12((uStack_9e4 != 0) *
                                                                             (uStack_9e4 < 0x100) *
                                                                             (char)(uVar83 >> 0x20)
                                                                             - (0xff < uStack_9e4),
                                                                             CONCAT11(bVar13,(
                                                  local_9e8 != 0) * (local_9e8 < 0x100) *
                                                  (char)uVar83 - (0xff < local_9e8))))))) &
           0xff00ff00ff00ff;
  local_a78 = (ushort)uVar95;
  uStack_a76 = (ushort)(uVar95 >> 0x10);
  uStack_a74 = (ushort)(uVar95 >> 0x20);
  uStack_a72 = (ushort)(uVar95 >> 0x30);
  uStack_a70 = (ushort)uVar107;
  uStack_a6e = (ushort)(uVar107 >> 0x10);
  uStack_a6c = (ushort)(uVar107 >> 0x20);
  uStack_a6a = (ushort)(uVar107 >> 0x30);
  local_a88 = (ushort)uVar82;
  uStack_a86 = (ushort)(uVar82 >> 0x10);
  uStack_a84 = (ushort)(uVar82 >> 0x20);
  uStack_a82 = (ushort)(uVar82 >> 0x30);
  uStack_a80 = (ushort)uVar83;
  uStack_a7e = (ushort)(uVar83 >> 0x10);
  uStack_a7c = (ushort)(uVar83 >> 0x20);
  uStack_a7a = (ushort)(uVar83 >> 0x30);
  bVar49 = (uStack_a76 != 0) * (uStack_a76 < 0x100) * (char)(uVar95 >> 0x10) - (0xff < uStack_a76);
  bVar50 = (uStack_a72 != 0) * (uStack_a72 < 0x100) * (char)(uVar95 >> 0x30) - (0xff < uStack_a72);
  bVar51 = (uStack_a6e != 0) * (uStack_a6e < 0x100) * (char)(uVar107 >> 0x10) - (0xff < uStack_a6e);
  bVar52 = (uStack_a6a != 0) * (uStack_a6a < 0x100) * (char)(uVar107 >> 0x30) - (0xff < uStack_a6a);
  bVar53 = (uStack_a86 != 0) * (uStack_a86 < 0x100) * (char)(uVar82 >> 0x10) - (0xff < uStack_a86);
  bVar54 = (uStack_a82 != 0) * (uStack_a82 < 0x100) * (char)(uVar82 >> 0x30) - (0xff < uStack_a82);
  bVar55 = (uStack_a7e != 0) * (uStack_a7e < 0x100) * (char)(uVar83 >> 0x10) - (0xff < uStack_a7e);
  bVar56 = (uStack_a7a != 0) * (uStack_a7a < 0x100) * (char)(uVar83 >> 0x30) - (0xff < uStack_a7a);
  uVar87 = (ulong)CONCAT16((uStack_9ec != 0) * (uStack_9ec < 0x100) * (char)(uVar109 >> 0x20) -
                           (0xff < uStack_9ec),
                           CONCAT15(bVar23,CONCAT14((uStack_9f0 != 0) * (uStack_9f0 < 0x100) *
                                                    (char)uVar109 - (0xff < uStack_9f0),
                                                    CONCAT13(bVar24,CONCAT12((uStack_9f4 != 0) *
                                                                             (uStack_9f4 < 0x100) *
                                                                             (char)(uVar97 >> 0x20)
                                                                             - (0xff < uStack_9f4),
                                                                             CONCAT11(bVar19,(
                                                  local_9f8 != 0) * (local_9f8 < 0x100) *
                                                  (char)uVar97 - (0xff < local_9f8))))))) &
           0xff00ff00ff00ff;
  uVar84 = (ulong)CONCAT16((uStack_9fc != 0) * (uStack_9fc < 0x100) * (char)(uVar89 >> 0x20) -
                           (0xff < uStack_9fc),
                           CONCAT15(bVar18,CONCAT14((uStack_a00 != 0) * (uStack_a00 < 0x100) *
                                                    (char)uVar89 - (0xff < uStack_a00),
                                                    CONCAT13(bVar20,CONCAT12((uStack_a04 != 0) *
                                                                             (uStack_a04 < 0x100) *
                                                                             (char)(uVar84 >> 0x20)
                                                                             - (0xff < uStack_a04),
                                                                             CONCAT11(bVar21,(
                                                  local_a08 != 0) * (local_a08 < 0x100) *
                                                  (char)uVar84 - (0xff < local_a08))))))) &
           0xff00ff00ff00ff;
  uVar85 = (ulong)CONCAT16((uStack_54c != 0) * (uStack_54c < 0x100) * (char)(uVar90 >> 0x28) -
                           (0xff < uStack_54c),
                           CONCAT15(bVar30,CONCAT14((uStack_550 != 0) * (uStack_550 < 0x100) *
                                                    (char)(uVar90 >> 8) - (0xff < uStack_550),
                                                    CONCAT13(bVar31,CONCAT12((uStack_554 != 0) *
                                                                             (uStack_554 < 0x100) *
                                                                             (char)(uVar85 >> 0x28)
                                                                             - (0xff < uStack_554),
                                                                             CONCAT11(bVar25,(
                                                  local_558 != 0) * (local_558 < 0x100) *
                                                  (char)(uVar85 >> 8) - (0xff < local_558))))))) &
           0xff00ff00ff00ff;
  uVar110 = (ulong)CONCAT16((uStack_56c != 0) * (uStack_56c < 0x100) * (char)(uVar110 >> 0x28) -
                            (0xff < uStack_56c),
                            CONCAT15(bVar27,CONCAT14((uStack_570 != 0) * (uStack_570 < 0x100) *
                                                     (char)(uVar110 >> 8) - (0xff < uStack_570),
                                                     CONCAT13(bVar28,CONCAT12((uStack_574 != 0) *
                                                                              (uStack_574 < 0x100) *
                                                                              (char)(uVar98 >> 0x28)
                                                                              - (0xff < uStack_574),
                                                                              CONCAT11(bVar32,(
                                                  local_578 != 0) * (local_578 < 0x100) *
                                                  (char)(uVar98 >> 8) - (0xff < local_578))))))) &
            0xff00ff00ff00ff;
  local_a98 = (ushort)uVar87;
  uStack_a96 = (ushort)(uVar87 >> 0x10);
  uStack_a94 = (ushort)(uVar87 >> 0x20);
  uStack_a92 = (ushort)(uVar87 >> 0x30);
  uStack_a90 = (ushort)uVar84;
  uStack_a8e = (ushort)(uVar84 >> 0x10);
  uStack_a8c = (ushort)(uVar84 >> 0x20);
  uStack_a8a = (ushort)(uVar84 >> 0x30);
  local_aa8 = (ushort)uVar85;
  uStack_aa6 = (ushort)(uVar85 >> 0x10);
  uStack_aa4 = (ushort)(uVar85 >> 0x20);
  uStack_aa2 = (ushort)(uVar85 >> 0x30);
  uStack_aa0 = (ushort)uVar110;
  uStack_a9e = (ushort)(uVar110 >> 0x10);
  uStack_a9c = (ushort)(uVar110 >> 0x20);
  uStack_a9a = (ushort)(uVar110 >> 0x30);
  bVar57 = (uStack_a96 != 0) * (uStack_a96 < 0x100) * (char)(uVar87 >> 0x10) - (0xff < uStack_a96);
  bVar58 = (uStack_a92 != 0) * (uStack_a92 < 0x100) * (char)(uVar87 >> 0x30) - (0xff < uStack_a92);
  bVar59 = (uStack_a8e != 0) * (uStack_a8e < 0x100) * (char)(uVar84 >> 0x10) - (0xff < uStack_a8e);
  bVar60 = (uStack_a8a != 0) * (uStack_a8a < 0x100) * (char)(uVar84 >> 0x30) - (0xff < uStack_a8a);
  bVar61 = (uStack_aa6 != 0) * (uStack_aa6 < 0x100) * (char)(uVar85 >> 0x10) - (0xff < uStack_aa6);
  bVar62 = (uStack_aa2 != 0) * (uStack_aa2 < 0x100) * (char)(uVar85 >> 0x30) - (0xff < uStack_aa2);
  bVar63 = (uStack_a9e != 0) * (uStack_a9e < 0x100) * (char)(uVar110 >> 0x10) - (0xff < uStack_a9e);
  bVar64 = (uStack_a9a != 0) * (uStack_a9a < 0x100) * (char)(uVar110 >> 0x30) - (0xff < uStack_a9a);
  uVar99 = (ulong)CONCAT16((uStack_58c != 0) * (uStack_58c < 0x100) * (char)(uVar99 >> 0x28) -
                           (0xff < uStack_58c),
                           CONCAT15(bVar38,CONCAT14((uStack_590 != 0) * (uStack_590 < 0x100) *
                                                    (char)(uVar99 >> 8) - (0xff < uStack_590),
                                                    CONCAT13(bVar40,CONCAT12((uStack_594 != 0) *
                                                                             (uStack_594 < 0x100) *
                                                                             (char)(uVar91 >> 0x28)
                                                                             - (0xff < uStack_594),
                                                                             CONCAT11(bVar39,(
                                                  local_598 != 0) * (local_598 < 0x100) *
                                                  (char)(uVar91 >> 8) - (0xff < local_598))))))) &
           0xff00ff00ff00ff;
  uVar111 = (ulong)CONCAT16((uStack_5ac != 0) * (uStack_5ac < 0x100) * (char)(uVar111 >> 0x28) -
                            (0xff < uStack_5ac),
                            CONCAT15(bVar34,CONCAT14((uStack_5b0 != 0) * (uStack_5b0 < 0x100) *
                                                     (char)(uVar111 >> 8) - (0xff < uStack_5b0),
                                                     CONCAT13(bVar33,CONCAT12((uStack_5b4 != 0) *
                                                                              (uStack_5b4 < 0x100) *
                                                                              (char)(uVar100 >> 0x28
                                                                                    ) - (0xff < 
                                                  uStack_5b4),
                                                  CONCAT11(bVar35,(local_5b8 != 0) *
                                                                  (local_5b8 < 0x100) *
                                                                  (char)(uVar100 >> 8) -
                                                                  (0xff < local_5b8))))))) &
            0xff00ff00ff00ff;
  uVar90 = (ulong)CONCAT16((uStack_5cc != 0) * (uStack_5cc < 0x100) * (char)(uVar79 >> 0x28) -
                           (0xff < uStack_5cc),
                           CONCAT15(bVar46,CONCAT14((uStack_5d0 != 0) * (uStack_5d0 < 0x100) *
                                                    (char)(uVar79 >> 8) - (0xff < uStack_5d0),
                                                    CONCAT13(bVar47,CONCAT12((uStack_5d4 != 0) *
                                                                             (uStack_5d4 < 0x100) *
                                                                             (char)(uVar112 >> 0x28)
                                                                             - (0xff < uStack_5d4),
                                                                             CONCAT11(bVar48,(
                                                  local_5d8 != 0) * (local_5d8 < 0x100) *
                                                  (char)(uVar112 >> 8) - (0xff < local_5d8))))))) &
           0xff00ff00ff00ff;
  uVar91 = (ulong)CONCAT16((uStack_5ec != 0) * (uStack_5ec < 0x100) * (char)(uVar81 >> 0x28) -
                           (0xff < uStack_5ec),
                           CONCAT15(bVar43,CONCAT14((uStack_5f0 != 0) * (uStack_5f0 < 0x100) *
                                                    (char)(uVar81 >> 8) - (0xff < uStack_5f0),
                                                    CONCAT13(bVar44,CONCAT12((uStack_5f4 != 0) *
                                                                             (uStack_5f4 < 0x100) *
                                                                             (char)(uVar80 >> 0x28)
                                                                             - (0xff < uStack_5f4),
                                                                             CONCAT11(bVar41,(
                                                  local_5f8 != 0) * (local_5f8 < 0x100) *
                                                  (char)(uVar80 >> 8) - (0xff < local_5f8))))))) &
           0xff00ff00ff00ff;
  local_ab8 = (ushort)uVar99;
  uStack_ab6 = (ushort)(uVar99 >> 0x10);
  uStack_ab4 = (ushort)(uVar99 >> 0x20);
  uStack_ab2 = (ushort)(uVar99 >> 0x30);
  uStack_ab0 = (ushort)uVar111;
  uStack_aae = (ushort)(uVar111 >> 0x10);
  uStack_aac = (ushort)(uVar111 >> 0x20);
  uStack_aaa = (ushort)(uVar111 >> 0x30);
  local_ac8 = (ushort)uVar90;
  uStack_ac6 = (ushort)(uVar90 >> 0x10);
  uStack_ac4 = (ushort)(uVar90 >> 0x20);
  uStack_ac2 = (ushort)(uVar90 >> 0x30);
  uStack_ac0 = (ushort)uVar91;
  uStack_abe = (ushort)(uVar91 >> 0x10);
  uStack_abc = (ushort)(uVar91 >> 0x20);
  uStack_aba = (ushort)(uVar91 >> 0x30);
  bVar65 = (uStack_ab6 != 0) * (uStack_ab6 < 0x100) * (char)(uVar99 >> 0x10) - (0xff < uStack_ab6);
  bVar66 = (uStack_ab2 != 0) * (uStack_ab2 < 0x100) * (char)(uVar99 >> 0x30) - (0xff < uStack_ab2);
  bVar67 = (uStack_aae != 0) * (uStack_aae < 0x100) * (char)(uVar111 >> 0x10) - (0xff < uStack_aae);
  bVar68 = (uStack_aaa != 0) * (uStack_aaa < 0x100) * (char)(uVar111 >> 0x30) - (0xff < uStack_aaa);
  bVar69 = (uStack_ac6 != 0) * (uStack_ac6 < 0x100) * (char)(uVar90 >> 0x10) - (0xff < uStack_ac6);
  bVar70 = (uStack_ac2 != 0) * (uStack_ac2 < 0x100) * (char)(uVar90 >> 0x30) - (0xff < uStack_ac2);
  bVar71 = (uStack_abe != 0) * (uStack_abe < 0x100) * (char)(uVar91 >> 0x10) - (0xff < uStack_abe);
  bVar72 = (uStack_aba != 0) * (uStack_aba < 0x100) * (char)(uVar91 >> 0x30) - (0xff < uStack_aba);
  uVar94 = (ushort)(((uint)bVar1 << 0x18) >> 0x18);
  uVar120 = (ushort)(((uint6)bVar8 << 0x28) >> 0x28);
  uVar102 = (ushort)(((ulong)bVar7 << 0x38) >> 0x38);
  uVar105 = (ushort)(((uint)bVar5 << 0x18) >> 0x18);
  uVar116 = (ushort)(((uint6)bVar4 << 0x28) >> 0x28);
  uVar113 = (ushort)(((ulong)bVar3 << 0x38) >> 0x38);
  uVar86 = (ushort)(((uint)bVar9 << 0x18) >> 0x18);
  uVar93 = (ushort)(((uint6)bVar10 << 0x28) >> 0x28);
  uVar104 = (ushort)(((ulong)bVar12 << 0x38) >> 0x38);
  uVar119 = (ushort)(((uint)bVar14 << 0x18) >> 0x18);
  uVar101 = (ushort)(((uint6)bVar15 << 0x28) >> 0x28);
  uVar92 = (ushort)(((ulong)bVar16 << 0x38) >> 0x38);
  bVar73 = (uVar94 != 0) * (uVar94 < 0x100) * bVar1 - (0xff < uVar94);
  bVar74 = (uVar102 != 0) * (uVar102 < 0x100) * bVar7 - (0xff < uVar102);
  bVar75 = (uVar105 != 0) * (uVar105 < 0x100) * bVar5 - (0xff < uVar105);
  bVar76 = (uVar113 != 0) * (uVar113 < 0x100) * bVar3 - (0xff < uVar113);
  bVar1 = (uVar86 != 0) * (uVar86 < 0x100) * bVar9 - (0xff < uVar86);
  bVar7 = (uVar104 != 0) * (uVar104 < 0x100) * bVar12 - (0xff < uVar104);
  bVar3 = (uVar119 != 0) * (uVar119 < 0x100) * bVar14 - (0xff < uVar119);
  bVar5 = (uVar92 != 0) * (uVar92 < 0x100) * bVar16 - (0xff < uVar92);
  uVar105 = (ushort)(((uint)bVar24 << 0x18) >> 0x18);
  uVar103 = (ushort)(((uint6)bVar23 << 0x28) >> 0x28);
  uVar113 = (ushort)(((ulong)bVar22 << 0x38) >> 0x38);
  uVar115 = (ushort)(((uint)bVar20 << 0x18) >> 0x18);
  uVar117 = (ushort)(((uint6)bVar18 << 0x28) >> 0x28);
  uVar121 = (ushort)(((ulong)bVar17 << 0x38) >> 0x38);
  uVar86 = (ushort)(((uint)bVar31 << 0x18) >> 0x18);
  uVar104 = (ushort)(((uint6)bVar30 << 0x28) >> 0x28);
  uVar119 = (ushort)(((ulong)bVar29 << 0x38) >> 0x38);
  uVar92 = (ushort)(((uint)bVar28 << 0x18) >> 0x18);
  uVar102 = (ushort)(((uint6)bVar27 << 0x28) >> 0x28);
  uVar94 = (ushort)(((ulong)bVar26 << 0x38) >> 0x38);
  bVar77 = (uVar105 != 0) * (uVar105 < 0x100) * bVar24 - (0xff < uVar105);
  bVar78 = (uVar113 != 0) * (uVar113 < 0x100) * bVar22 - (0xff < uVar113);
  bVar22 = (uVar115 != 0) * (uVar115 < 0x100) * bVar20 - (0xff < uVar115);
  bVar24 = (uVar121 != 0) * (uVar121 < 0x100) * bVar17 - (0xff < uVar121);
  bVar9 = (uVar86 != 0) * (uVar86 < 0x100) * bVar31 - (0xff < uVar86);
  bVar12 = (uVar119 != 0) * (uVar119 < 0x100) * bVar29 - (0xff < uVar119);
  bVar16 = (uVar92 != 0) * (uVar92 < 0x100) * bVar28 - (0xff < uVar92);
  bVar14 = (uVar94 != 0) * (uVar94 < 0x100) * bVar26 - (0xff < uVar94);
  uVar115 = (ushort)(((uint)bVar40 << 0x18) >> 0x18);
  uVar121 = (ushort)(((uint6)bVar38 << 0x28) >> 0x28);
  uVar106 = (ushort)(((ulong)bVar37 << 0x38) >> 0x38);
  uVar114 = (ushort)(((uint)bVar33 << 0x18) >> 0x18);
  uVar118 = (ushort)(((uint6)bVar34 << 0x28) >> 0x28);
  uVar122 = (ushort)(((ulong)bVar36 << 0x38) >> 0x38);
  uVar86 = (ushort)(((uint)bVar47 << 0x18) >> 0x18);
  uVar119 = (ushort)(((uint6)bVar46 << 0x28) >> 0x28);
  uVar92 = (ushort)(((ulong)bVar45 << 0x38) >> 0x38);
  uVar94 = (ushort)(((uint)bVar44 << 0x18) >> 0x18);
  uVar105 = (ushort)(((uint6)bVar43 << 0x28) >> 0x28);
  uVar113 = (ushort)(((ulong)bVar42 << 0x38) >> 0x38);
  bVar20 = (uVar115 != 0) * (uVar115 < 0x100) * bVar40 - (0xff < uVar115);
  bVar17 = (uVar106 != 0) * (uVar106 < 0x100) * bVar37 - (0xff < uVar106);
  bVar26 = (uVar114 != 0) * (uVar114 < 0x100) * bVar33 - (0xff < uVar114);
  bVar28 = (uVar122 != 0) * (uVar122 < 0x100) * bVar36 - (0xff < uVar122);
  bVar29 = (uVar86 != 0) * (uVar86 < 0x100) * bVar47 - (0xff < uVar86);
  bVar31 = (uVar92 != 0) * (uVar92 < 0x100) * bVar45 - (0xff < uVar92);
  bVar40 = (uVar94 != 0) * (uVar94 < 0x100) * bVar44 - (0xff < uVar94);
  bVar37 = (uVar113 != 0) * (uVar113 < 0x100) * bVar42 - (0xff < uVar113);
  uVar100 = (ulong)CONCAT16((uStack_a6c != 0) * (uStack_a6c < 0x100) * (char)(uVar107 >> 0x20) -
                            (0xff < uStack_a6c),
                            CONCAT15(bVar51,CONCAT14((uStack_a70 != 0) * (uStack_a70 < 0x100) *
                                                     (char)uVar107 - (0xff < uStack_a70),
                                                     CONCAT13(bVar50,CONCAT12((uStack_a74 != 0) *
                                                                              (uStack_a74 < 0x100) *
                                                                              (char)(uVar95 >> 0x20)
                                                                              - (0xff < uStack_a74),
                                                                              CONCAT11(bVar49,(
                                                  local_a78 != 0) * (local_a78 < 0x100) *
                                                  (char)uVar95 - (0xff < local_a78))))))) &
            0xff00ff00ff00ff;
  uVar112 = (ulong)CONCAT16((uStack_a7c != 0) * (uStack_a7c < 0x100) * (char)(uVar83 >> 0x20) -
                            (0xff < uStack_a7c),
                            CONCAT15(bVar55,CONCAT14((uStack_a80 != 0) * (uStack_a80 < 0x100) *
                                                     (char)uVar83 - (0xff < uStack_a80),
                                                     CONCAT13(bVar54,CONCAT12((uStack_a84 != 0) *
                                                                              (uStack_a84 < 0x100) *
                                                                              (char)(uVar82 >> 0x20)
                                                                              - (0xff < uStack_a84),
                                                                              CONCAT11(bVar53,(
                                                  local_a88 != 0) * (local_a88 < 0x100) *
                                                  (char)uVar82 - (0xff < local_a88))))))) &
            0xff00ff00ff00ff;
  uVar98 = (ulong)CONCAT16((uStack_a8c != 0) * (uStack_a8c < 0x100) * (char)(uVar84 >> 0x20) -
                           (0xff < uStack_a8c),
                           CONCAT15(bVar59,CONCAT14((uStack_a90 != 0) * (uStack_a90 < 0x100) *
                                                    (char)uVar84 - (0xff < uStack_a90),
                                                    CONCAT13(bVar58,CONCAT12((uStack_a94 != 0) *
                                                                             (uStack_a94 < 0x100) *
                                                                             (char)(uVar87 >> 0x20)
                                                                             - (0xff < uStack_a94),
                                                                             CONCAT11(bVar57,(
                                                  local_a98 != 0) * (local_a98 < 0x100) *
                                                  (char)uVar87 - (0xff < local_a98))))))) &
           0xff00ff00ff00ff;
  uVar85 = (ulong)CONCAT16((uStack_a9c != 0) * (uStack_a9c < 0x100) * (char)(uVar110 >> 0x20) -
                           (0xff < uStack_a9c),
                           CONCAT15(bVar63,CONCAT14((uStack_aa0 != 0) * (uStack_aa0 < 0x100) *
                                                    (char)uVar110 - (0xff < uStack_aa0),
                                                    CONCAT13(bVar62,CONCAT12((uStack_aa4 != 0) *
                                                                             (uStack_aa4 < 0x100) *
                                                                             (char)(uVar85 >> 0x20)
                                                                             - (0xff < uStack_aa4),
                                                                             CONCAT11(bVar61,(
                                                  local_aa8 != 0) * (local_aa8 < 0x100) *
                                                  (char)uVar85 - (0xff < local_aa8))))))) &
           0xff00ff00ff00ff;
  local_b38 = (ushort)uVar100;
  uStack_b36 = (ushort)(uVar100 >> 0x10);
  uStack_b34 = (ushort)(uVar100 >> 0x20);
  uStack_b32 = (ushort)(uVar100 >> 0x30);
  uStack_b30 = (ushort)uVar112;
  uStack_b2e = (ushort)(uVar112 >> 0x10);
  uStack_b2c = (ushort)(uVar112 >> 0x20);
  uStack_b2a = (ushort)(uVar112 >> 0x30);
  local_b48 = (ushort)uVar98;
  uStack_b46 = (ushort)(uVar98 >> 0x10);
  uStack_b44 = (ushort)(uVar98 >> 0x20);
  uStack_b42 = (ushort)(uVar98 >> 0x30);
  uStack_b40 = (ushort)uVar85;
  uStack_b3e = (ushort)(uVar85 >> 0x10);
  uStack_b3c = (ushort)(uVar85 >> 0x20);
  uStack_b3a = (ushort)(uVar85 >> 0x30);
  *(char *)in_RDI = (local_b38 != 0) * (local_b38 < 0x100) * (char)uVar100 - (0xff < local_b38);
  *(char *)((long)in_RDI + 1) =
       (uStack_b36 != 0) * (uStack_b36 < 0x100) * (char)(uVar100 >> 0x10) - (0xff < uStack_b36);
  *(char *)((long)in_RDI + 2) =
       (uStack_b34 != 0) * (uStack_b34 < 0x100) * (char)(uVar100 >> 0x20) - (0xff < uStack_b34);
  *(char *)((long)in_RDI + 3) =
       (uStack_b32 != 0) * (uStack_b32 < 0x100) * (char)(uVar100 >> 0x30) - (0xff < uStack_b32);
  *(char *)((long)in_RDI + 4) =
       (uStack_b30 != 0) * (uStack_b30 < 0x100) * (char)uVar112 - (0xff < uStack_b30);
  *(char *)((long)in_RDI + 5) =
       (uStack_b2e != 0) * (uStack_b2e < 0x100) * (char)(uVar112 >> 0x10) - (0xff < uStack_b2e);
  *(char *)((long)in_RDI + 6) =
       (uStack_b2c != 0) * (uStack_b2c < 0x100) * (char)(uVar112 >> 0x20) - (0xff < uStack_b2c);
  *(char *)((long)in_RDI + 7) =
       (uStack_b2a != 0) * (uStack_b2a < 0x100) * (char)(uVar112 >> 0x30) - (0xff < uStack_b2a);
  *(char *)(in_RDI + 1) = (local_b48 != 0) * (local_b48 < 0x100) * (char)uVar98 - (0xff < local_b48)
  ;
  *(char *)((long)in_RDI + 9) =
       (uStack_b46 != 0) * (uStack_b46 < 0x100) * (char)(uVar98 >> 0x10) - (0xff < uStack_b46);
  *(char *)((long)in_RDI + 10) =
       (uStack_b44 != 0) * (uStack_b44 < 0x100) * (char)(uVar98 >> 0x20) - (0xff < uStack_b44);
  *(char *)((long)in_RDI + 0xb) =
       (uStack_b42 != 0) * (uStack_b42 < 0x100) * (char)(uVar98 >> 0x30) - (0xff < uStack_b42);
  *(char *)((long)in_RDI + 0xc) =
       (uStack_b40 != 0) * (uStack_b40 < 0x100) * (char)uVar85 - (0xff < uStack_b40);
  *(char *)((long)in_RDI + 0xd) =
       (uStack_b3e != 0) * (uStack_b3e < 0x100) * (char)(uVar85 >> 0x10) - (0xff < uStack_b3e);
  *(char *)((long)in_RDI + 0xe) =
       (uStack_b3c != 0) * (uStack_b3c < 0x100) * (char)(uVar85 >> 0x20) - (0xff < uStack_b3c);
  *(char *)((long)in_RDI + 0xf) =
       (uStack_b3a != 0) * (uStack_b3a < 0x100) * (char)(uVar85 >> 0x30) - (0xff < uStack_b3a);
  uVar98 = (ulong)CONCAT16((uStack_aac != 0) * (uStack_aac < 0x100) * (char)(uVar111 >> 0x20) -
                           (0xff < uStack_aac),
                           CONCAT15(bVar67,CONCAT14((uStack_ab0 != 0) * (uStack_ab0 < 0x100) *
                                                    (char)uVar111 - (0xff < uStack_ab0),
                                                    CONCAT13(bVar66,CONCAT12((uStack_ab4 != 0) *
                                                                             (uStack_ab4 < 0x100) *
                                                                             (char)(uVar99 >> 0x20)
                                                                             - (0xff < uStack_ab4),
                                                                             CONCAT11(bVar65,(
                                                  local_ab8 != 0) * (local_ab8 < 0x100) *
                                                  (char)uVar99 - (0xff < local_ab8))))))) &
           0xff00ff00ff00ff;
  uVar110 = (ulong)CONCAT16((uStack_abc != 0) * (uStack_abc < 0x100) * (char)(uVar91 >> 0x20) -
                            (0xff < uStack_abc),
                            CONCAT15(bVar71,CONCAT14((uStack_ac0 != 0) * (uStack_ac0 < 0x100) *
                                                     (char)uVar91 - (0xff < uStack_ac0),
                                                     CONCAT13(bVar70,CONCAT12((uStack_ac4 != 0) *
                                                                              (uStack_ac4 < 0x100) *
                                                                              (char)(uVar90 >> 0x20)
                                                                              - (0xff < uStack_ac4),
                                                                              CONCAT11(bVar69,(
                                                  local_ac8 != 0) * (local_ac8 < 0x100) *
                                                  (char)uVar90 - (0xff < local_ac8))))))) &
            0xff00ff00ff00ff;
  uVar85 = (ulong)CONCAT16((uVar116 != 0) * (uVar116 < 0x100) * bVar4 - (0xff < uVar116),
                           CONCAT15(bVar75,CONCAT14((bVar6 != 0) * (bVar6 < 0x100) * bVar6 -
                                                    (0xff < bVar6),
                                                    CONCAT13(bVar74,CONCAT12((uVar120 != 0) *
                                                                             (uVar120 < 0x100) *
                                                                             bVar8 - (0xff < uVar120
                                                                                     ),
                                                                             CONCAT11(bVar73,(bVar2 
                                                  != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2)))
                                                  )))) & 0xff00ff00ff00ff;
  uVar90 = (ulong)CONCAT16((uVar101 != 0) * (uVar101 < 0x100) * bVar15 - (0xff < uVar101),
                           CONCAT15(bVar3,CONCAT14((bVar13 != 0) * (bVar13 < 0x100) * bVar13 -
                                                   (0xff < bVar13),
                                                   CONCAT13(bVar7,CONCAT12((uVar93 != 0) *
                                                                           (uVar93 < 0x100) * bVar10
                                                                           - (0xff < uVar93),
                                                                           CONCAT11(bVar1,(bVar11 !=
                                                                                          0) * (
                                                  bVar11 < 0x100) * bVar11 - (0xff < bVar11))))))) &
           0xff00ff00ff00ff;
  local_b58 = (ushort)uVar98;
  uStack_b56 = (ushort)(uVar98 >> 0x10);
  uStack_b54 = (ushort)(uVar98 >> 0x20);
  uStack_b52 = (ushort)(uVar98 >> 0x30);
  uStack_b50 = (ushort)uVar110;
  uStack_b4e = (ushort)(uVar110 >> 0x10);
  uStack_b4c = (ushort)(uVar110 >> 0x20);
  uStack_b4a = (ushort)(uVar110 >> 0x30);
  local_b68 = (ushort)uVar85;
  uStack_b66 = (ushort)(uVar85 >> 0x10);
  uStack_b64 = (ushort)(uVar85 >> 0x20);
  uStack_b62 = (ushort)(uVar85 >> 0x30);
  uStack_b60 = (ushort)uVar90;
  uStack_b5e = (ushort)(uVar90 >> 0x10);
  uStack_b5c = (ushort)(uVar90 >> 0x20);
  uStack_b5a = (ushort)(uVar90 >> 0x30);
  *(char *)in_RSI = (local_b58 != 0) * (local_b58 < 0x100) * (char)uVar98 - (0xff < local_b58);
  *(char *)((long)in_RSI + 1) =
       (uStack_b56 != 0) * (uStack_b56 < 0x100) * (char)(uVar98 >> 0x10) - (0xff < uStack_b56);
  *(char *)((long)in_RSI + 2) =
       (uStack_b54 != 0) * (uStack_b54 < 0x100) * (char)(uVar98 >> 0x20) - (0xff < uStack_b54);
  *(char *)((long)in_RSI + 3) =
       (uStack_b52 != 0) * (uStack_b52 < 0x100) * (char)(uVar98 >> 0x30) - (0xff < uStack_b52);
  *(char *)((long)in_RSI + 4) =
       (uStack_b50 != 0) * (uStack_b50 < 0x100) * (char)uVar110 - (0xff < uStack_b50);
  *(char *)((long)in_RSI + 5) =
       (uStack_b4e != 0) * (uStack_b4e < 0x100) * (char)(uVar110 >> 0x10) - (0xff < uStack_b4e);
  *(char *)((long)in_RSI + 6) =
       (uStack_b4c != 0) * (uStack_b4c < 0x100) * (char)(uVar110 >> 0x20) - (0xff < uStack_b4c);
  *(char *)((long)in_RSI + 7) =
       (uStack_b4a != 0) * (uStack_b4a < 0x100) * (char)(uVar110 >> 0x30) - (0xff < uStack_b4a);
  *(char *)(in_RSI + 1) = (local_b68 != 0) * (local_b68 < 0x100) * (char)uVar85 - (0xff < local_b68)
  ;
  *(char *)((long)in_RSI + 9) =
       (uStack_b66 != 0) * (uStack_b66 < 0x100) * (char)(uVar85 >> 0x10) - (0xff < uStack_b66);
  *(char *)((long)in_RSI + 10) =
       (uStack_b64 != 0) * (uStack_b64 < 0x100) * (char)(uVar85 >> 0x20) - (0xff < uStack_b64);
  *(char *)((long)in_RSI + 0xb) =
       (uStack_b62 != 0) * (uStack_b62 < 0x100) * (char)(uVar85 >> 0x30) - (0xff < uStack_b62);
  *(char *)((long)in_RSI + 0xc) =
       (uStack_b60 != 0) * (uStack_b60 < 0x100) * (char)uVar90 - (0xff < uStack_b60);
  *(char *)((long)in_RSI + 0xd) =
       (uStack_b5e != 0) * (uStack_b5e < 0x100) * (char)(uVar90 >> 0x10) - (0xff < uStack_b5e);
  *(char *)((long)in_RSI + 0xe) =
       (uStack_b5c != 0) * (uStack_b5c < 0x100) * (char)(uVar90 >> 0x20) - (0xff < uStack_b5c);
  *(char *)((long)in_RSI + 0xf) =
       (uStack_b5a != 0) * (uStack_b5a < 0x100) * (char)(uVar90 >> 0x30) - (0xff < uStack_b5a);
  uVar98 = (ulong)CONCAT16((uVar117 != 0) * (uVar117 < 0x100) * bVar18 - (0xff < uVar117),
                           CONCAT15(bVar22,CONCAT14((bVar21 != 0) * (bVar21 < 0x100) * bVar21 -
                                                    (0xff < bVar21),
                                                    CONCAT13(bVar78,CONCAT12((uVar103 != 0) *
                                                                             (uVar103 < 0x100) *
                                                                             bVar23 - (0xff < 
                                                  uVar103),CONCAT11(bVar77,(bVar19 != 0) *
                                                                           (bVar19 < 0x100) * bVar19
                                                                           - (0xff < bVar19))))))) &
           0xff00ff00ff00ff;
  uVar110 = (ulong)CONCAT16((uVar102 != 0) * (uVar102 < 0x100) * bVar27 - (0xff < uVar102),
                            CONCAT15(bVar16,CONCAT14((bVar32 != 0) * (bVar32 < 0x100) * bVar32 -
                                                     (0xff < bVar32),
                                                     CONCAT13(bVar12,CONCAT12((uVar104 != 0) *
                                                                              (uVar104 < 0x100) *
                                                                              bVar30 - (0xff < 
                                                  uVar104),CONCAT11(bVar9,(bVar25 != 0) *
                                                                          (bVar25 < 0x100) * bVar25
                                                                          - (0xff < bVar25))))))) &
            0xff00ff00ff00ff;
  uVar85 = (ulong)CONCAT16((uVar118 != 0) * (uVar118 < 0x100) * bVar34 - (0xff < uVar118),
                           CONCAT15(bVar26,CONCAT14((bVar35 != 0) * (bVar35 < 0x100) * bVar35 -
                                                    (0xff < bVar35),
                                                    CONCAT13(bVar17,CONCAT12((uVar121 != 0) *
                                                                             (uVar121 < 0x100) *
                                                                             bVar38 - (0xff < 
                                                  uVar121),CONCAT11(bVar20,(bVar39 != 0) *
                                                                           (bVar39 < 0x100) * bVar39
                                                                           - (0xff < bVar39))))))) &
           0xff00ff00ff00ff;
  uVar90 = (ulong)CONCAT16((uVar105 != 0) * (uVar105 < 0x100) * bVar43 - (0xff < uVar105),
                           CONCAT15(bVar40,CONCAT14((bVar41 != 0) * (bVar41 < 0x100) * bVar41 -
                                                    (0xff < bVar41),
                                                    CONCAT13(bVar31,CONCAT12((uVar119 != 0) *
                                                                             (uVar119 < 0x100) *
                                                                             bVar46 - (0xff < 
                                                  uVar119),CONCAT11(bVar29,(bVar48 != 0) *
                                                                           (bVar48 < 0x100) * bVar48
                                                                           - (0xff < bVar48))))))) &
           0xff00ff00ff00ff;
  local_b78 = (ushort)uVar98;
  uStack_b76 = (ushort)(uVar98 >> 0x10);
  uStack_b74 = (ushort)(uVar98 >> 0x20);
  uStack_b72 = (ushort)(uVar98 >> 0x30);
  uStack_b70 = (ushort)uVar110;
  uStack_b6e = (ushort)(uVar110 >> 0x10);
  uStack_b6c = (ushort)(uVar110 >> 0x20);
  uStack_b6a = (ushort)(uVar110 >> 0x30);
  local_b88 = (ushort)uVar85;
  uStack_b86 = (ushort)(uVar85 >> 0x10);
  uStack_b84 = (ushort)(uVar85 >> 0x20);
  uStack_b82 = (ushort)(uVar85 >> 0x30);
  uStack_b80 = (ushort)uVar90;
  uStack_b7e = (ushort)(uVar90 >> 0x10);
  uStack_b7c = (ushort)(uVar90 >> 0x20);
  uStack_b7a = (ushort)(uVar90 >> 0x30);
  *(char *)in_RDX = (local_b78 != 0) * (local_b78 < 0x100) * (char)uVar98 - (0xff < local_b78);
  *(char *)((long)in_RDX + 1) =
       (uStack_b76 != 0) * (uStack_b76 < 0x100) * (char)(uVar98 >> 0x10) - (0xff < uStack_b76);
  *(char *)((long)in_RDX + 2) =
       (uStack_b74 != 0) * (uStack_b74 < 0x100) * (char)(uVar98 >> 0x20) - (0xff < uStack_b74);
  *(char *)((long)in_RDX + 3) =
       (uStack_b72 != 0) * (uStack_b72 < 0x100) * (char)(uVar98 >> 0x30) - (0xff < uStack_b72);
  *(char *)((long)in_RDX + 4) =
       (uStack_b70 != 0) * (uStack_b70 < 0x100) * (char)uVar110 - (0xff < uStack_b70);
  *(char *)((long)in_RDX + 5) =
       (uStack_b6e != 0) * (uStack_b6e < 0x100) * (char)(uVar110 >> 0x10) - (0xff < uStack_b6e);
  *(char *)((long)in_RDX + 6) =
       (uStack_b6c != 0) * (uStack_b6c < 0x100) * (char)(uVar110 >> 0x20) - (0xff < uStack_b6c);
  *(char *)((long)in_RDX + 7) =
       (uStack_b6a != 0) * (uStack_b6a < 0x100) * (char)(uVar110 >> 0x30) - (0xff < uStack_b6a);
  *(char *)(in_RDX + 1) = (local_b88 != 0) * (local_b88 < 0x100) * (char)uVar85 - (0xff < local_b88)
  ;
  *(char *)((long)in_RDX + 9) =
       (uStack_b86 != 0) * (uStack_b86 < 0x100) * (char)(uVar85 >> 0x10) - (0xff < uStack_b86);
  *(char *)((long)in_RDX + 10) =
       (uStack_b84 != 0) * (uStack_b84 < 0x100) * (char)(uVar85 >> 0x20) - (0xff < uStack_b84);
  *(char *)((long)in_RDX + 0xb) =
       (uStack_b82 != 0) * (uStack_b82 < 0x100) * (char)(uVar85 >> 0x30) - (0xff < uStack_b82);
  *(char *)((long)in_RDX + 0xc) =
       (uStack_b80 != 0) * (uStack_b80 < 0x100) * (char)uVar90 - (0xff < uStack_b80);
  *(char *)((long)in_RDX + 0xd) =
       (uStack_b7e != 0) * (uStack_b7e < 0x100) * (char)(uVar90 >> 0x10) - (0xff < uStack_b7e);
  *(char *)((long)in_RDX + 0xe) =
       (uStack_b7c != 0) * (uStack_b7c < 0x100) * (char)(uVar90 >> 0x20) - (0xff < uStack_b7c);
  *(char *)((long)in_RDX + 0xf) =
       (uStack_b7a != 0) * (uStack_b7a < 0x100) * (char)(uVar90 >> 0x30) - (0xff < uStack_b7a);
  uVar101 = (ushort)(((uint)bVar50 << 0x18) >> 0x18);
  uVar102 = (ushort)(((uint6)bVar51 << 0x28) >> 0x28);
  uVar105 = (ushort)(((ulong)bVar52 << 0x38) >> 0x38);
  uVar113 = (ushort)(((uint)bVar54 << 0x18) >> 0x18);
  uVar115 = (ushort)(((uint6)bVar55 << 0x28) >> 0x28);
  uVar120 = (ushort)(((ulong)bVar56 << 0x38) >> 0x38);
  uVar86 = (ushort)(((uint)bVar58 << 0x18) >> 0x18);
  uVar93 = (ushort)(((uint6)bVar59 << 0x28) >> 0x28);
  uVar104 = (ushort)(((ulong)bVar60 << 0x38) >> 0x38);
  uVar119 = (ushort)(((uint)bVar62 << 0x18) >> 0x18);
  uVar92 = (ushort)(((uint6)bVar63 << 0x28) >> 0x28);
  uVar94 = (ushort)(((ulong)bVar64 << 0x38) >> 0x38);
  *(byte *)in_RCX = (bVar49 != 0) * (bVar49 < 0x100) * bVar49 - (0xff < bVar49);
  *(byte *)((long)in_RCX + 1) = (uVar101 != 0) * (uVar101 < 0x100) * bVar50 - (0xff < uVar101);
  *(byte *)((long)in_RCX + 2) = (uVar102 != 0) * (uVar102 < 0x100) * bVar51 - (0xff < uVar102);
  *(byte *)((long)in_RCX + 3) = (uVar105 != 0) * (uVar105 < 0x100) * bVar52 - (0xff < uVar105);
  *(byte *)((long)in_RCX + 4) = (bVar53 != 0) * (bVar53 < 0x100) * bVar53 - (0xff < bVar53);
  *(byte *)((long)in_RCX + 5) = (uVar113 != 0) * (uVar113 < 0x100) * bVar54 - (0xff < uVar113);
  *(byte *)((long)in_RCX + 6) = (uVar115 != 0) * (uVar115 < 0x100) * bVar55 - (0xff < uVar115);
  *(byte *)((long)in_RCX + 7) = (uVar120 != 0) * (uVar120 < 0x100) * bVar56 - (0xff < uVar120);
  *(byte *)(in_RCX + 1) = (bVar57 != 0) * (bVar57 < 0x100) * bVar57 - (0xff < bVar57);
  *(byte *)((long)in_RCX + 9) = (uVar86 != 0) * (uVar86 < 0x100) * bVar58 - (0xff < uVar86);
  *(byte *)((long)in_RCX + 10) = (uVar93 != 0) * (uVar93 < 0x100) * bVar59 - (0xff < uVar93);
  *(byte *)((long)in_RCX + 0xb) = (uVar104 != 0) * (uVar104 < 0x100) * bVar60 - (0xff < uVar104);
  *(byte *)((long)in_RCX + 0xc) = (bVar61 != 0) * (bVar61 < 0x100) * bVar61 - (0xff < bVar61);
  *(byte *)((long)in_RCX + 0xd) = (uVar119 != 0) * (uVar119 < 0x100) * bVar62 - (0xff < uVar119);
  *(byte *)((long)in_RCX + 0xe) = (uVar92 != 0) * (uVar92 < 0x100) * bVar63 - (0xff < uVar92);
  *(byte *)((long)in_RCX + 0xf) = (uVar94 != 0) * (uVar94 < 0x100) * bVar64 - (0xff < uVar94);
  uVar101 = (ushort)(((uint)bVar66 << 0x18) >> 0x18);
  uVar102 = (ushort)(((uint6)bVar67 << 0x28) >> 0x28);
  uVar105 = (ushort)(((ulong)bVar68 << 0x38) >> 0x38);
  uVar113 = (ushort)(((uint)bVar70 << 0x18) >> 0x18);
  uVar115 = (ushort)(((uint6)bVar71 << 0x28) >> 0x28);
  uVar120 = (ushort)(((ulong)bVar72 << 0x38) >> 0x38);
  uVar86 = (ushort)(((uint)bVar74 << 0x18) >> 0x18);
  uVar93 = (ushort)(((uint6)bVar75 << 0x28) >> 0x28);
  uVar104 = (ushort)(((ulong)bVar76 << 0x38) >> 0x38);
  uVar119 = (ushort)(((uint)bVar7 << 0x18) >> 0x18);
  uVar92 = (ushort)(((uint6)bVar3 << 0x28) >> 0x28);
  uVar94 = (ushort)(((ulong)bVar5 << 0x38) >> 0x38);
  *(byte *)in_R8 = (bVar65 != 0) * (bVar65 < 0x100) * bVar65 - (0xff < bVar65);
  *(byte *)((long)in_R8 + 1) = (uVar101 != 0) * (uVar101 < 0x100) * bVar66 - (0xff < uVar101);
  *(byte *)((long)in_R8 + 2) = (uVar102 != 0) * (uVar102 < 0x100) * bVar67 - (0xff < uVar102);
  *(byte *)((long)in_R8 + 3) = (uVar105 != 0) * (uVar105 < 0x100) * bVar68 - (0xff < uVar105);
  *(byte *)((long)in_R8 + 4) = (bVar69 != 0) * (bVar69 < 0x100) * bVar69 - (0xff < bVar69);
  *(byte *)((long)in_R8 + 5) = (uVar113 != 0) * (uVar113 < 0x100) * bVar70 - (0xff < uVar113);
  *(byte *)((long)in_R8 + 6) = (uVar115 != 0) * (uVar115 < 0x100) * bVar71 - (0xff < uVar115);
  *(byte *)((long)in_R8 + 7) = (uVar120 != 0) * (uVar120 < 0x100) * bVar72 - (0xff < uVar120);
  *(byte *)(in_R8 + 1) = (bVar73 != 0) * (bVar73 < 0x100) * bVar73 - (0xff < bVar73);
  *(byte *)((long)in_R8 + 9) = (uVar86 != 0) * (uVar86 < 0x100) * bVar74 - (0xff < uVar86);
  *(byte *)((long)in_R8 + 10) = (uVar93 != 0) * (uVar93 < 0x100) * bVar75 - (0xff < uVar93);
  *(byte *)((long)in_R8 + 0xb) = (uVar104 != 0) * (uVar104 < 0x100) * bVar76 - (0xff < uVar104);
  *(byte *)((long)in_R8 + 0xc) = (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1);
  *(byte *)((long)in_R8 + 0xd) = (uVar119 != 0) * (uVar119 < 0x100) * bVar7 - (0xff < uVar119);
  *(byte *)((long)in_R8 + 0xe) = (uVar92 != 0) * (uVar92 < 0x100) * bVar3 - (0xff < uVar92);
  *(byte *)((long)in_R8 + 0xf) = (uVar94 != 0) * (uVar94 < 0x100) * bVar5 - (0xff < uVar94);
  uVar101 = (ushort)(((uint)bVar78 << 0x18) >> 0x18);
  uVar102 = (ushort)(((uint6)bVar22 << 0x28) >> 0x28);
  uVar105 = (ushort)(((ulong)bVar24 << 0x38) >> 0x38);
  uVar113 = (ushort)(((uint)bVar12 << 0x18) >> 0x18);
  uVar115 = (ushort)(((uint6)bVar16 << 0x28) >> 0x28);
  uVar120 = (ushort)(((ulong)bVar14 << 0x38) >> 0x38);
  uVar86 = (ushort)(((uint)bVar17 << 0x18) >> 0x18);
  uVar93 = (ushort)(((uint6)bVar26 << 0x28) >> 0x28);
  uVar104 = (ushort)(((ulong)bVar28 << 0x38) >> 0x38);
  uVar119 = (ushort)(((uint)bVar31 << 0x18) >> 0x18);
  uVar92 = (ushort)(((uint6)bVar40 << 0x28) >> 0x28);
  uVar94 = (ushort)(((ulong)bVar37 << 0x38) >> 0x38);
  *(byte *)in_R9 = (bVar77 != 0) * (bVar77 < 0x100) * bVar77 - (0xff < bVar77);
  *(byte *)((long)in_R9 + 1) = (uVar101 != 0) * (uVar101 < 0x100) * bVar78 - (0xff < uVar101);
  *(byte *)((long)in_R9 + 2) = (uVar102 != 0) * (uVar102 < 0x100) * bVar22 - (0xff < uVar102);
  *(byte *)((long)in_R9 + 3) = (uVar105 != 0) * (uVar105 < 0x100) * bVar24 - (0xff < uVar105);
  *(byte *)((long)in_R9 + 4) = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
  *(byte *)((long)in_R9 + 5) = (uVar113 != 0) * (uVar113 < 0x100) * bVar12 - (0xff < uVar113);
  *(byte *)((long)in_R9 + 6) = (uVar115 != 0) * (uVar115 < 0x100) * bVar16 - (0xff < uVar115);
  *(byte *)((long)in_R9 + 7) = (uVar120 != 0) * (uVar120 < 0x100) * bVar14 - (0xff < uVar120);
  *(byte *)(in_R9 + 1) = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
  *(byte *)((long)in_R9 + 9) = (uVar86 != 0) * (uVar86 < 0x100) * bVar17 - (0xff < uVar86);
  *(byte *)((long)in_R9 + 10) = (uVar93 != 0) * (uVar93 < 0x100) * bVar26 - (0xff < uVar93);
  *(byte *)((long)in_R9 + 0xb) = (uVar104 != 0) * (uVar104 < 0x100) * bVar28 - (0xff < uVar104);
  *(byte *)((long)in_R9 + 0xc) = (bVar29 != 0) * (bVar29 < 0x100) * bVar29 - (0xff < bVar29);
  *(byte *)((long)in_R9 + 0xd) = (uVar119 != 0) * (uVar119 < 0x100) * bVar31 - (0xff < uVar119);
  *(byte *)((long)in_R9 + 0xe) = (uVar92 != 0) * (uVar92 < 0x100) * bVar40 - (0xff < uVar92);
  *(byte *)((long)in_R9 + 0xf) = (uVar94 != 0) * (uVar94 < 0x100) * bVar37 - (0xff < uVar94);
  return;
}

Assistant:

static WEBP_INLINE void VP8PlanarTo24b_SSE2(
    __m128i* const in0, __m128i* const in1, __m128i* const in2,
    __m128i* const in3, __m128i* const in4, __m128i* const in5) {
  // The input is 6 registers of sixteen 8b but for the sake of explanation,
  // let's take 6 registers of four 8b values.
  // To pack, we will keep taking one every two 8b integer and move it
  // around as follows:
  // Input:
  //   r0r1r2r3 | r4r5r6r7 | g0g1g2g3 | g4g5g6g7 | b0b1b2b3 | b4b5b6b7
  // Split the 6 registers in two sets of 3 registers: the first set as the even
  // 8b bytes, the second the odd ones:
  //   r0r2r4r6 | g0g2g4g6 | b0b2b4b6 | r1r3r5r7 | g1g3g5g7 | b1b3b5b7
  // Repeat the same permutations twice more:
  //   r0r4g0g4 | b0b4r1r5 | g1g5b1b5 | r2r6g2g6 | b2b6r3r7 | g3g7b3b7
  //   r0g0b0r1 | g1b1r2g2 | b2r3g3b3 | r4g4b4r5 | g5b5r6g6 | b6r7g7b7
  __m128i tmp0, tmp1, tmp2, tmp3, tmp4, tmp5;
  VP8PlanarTo24bHelper(*in, tmp);
  VP8PlanarTo24bHelper(tmp, *in);
  VP8PlanarTo24bHelper(*in, tmp);
  // We need to do it two more times than the example as we have sixteen bytes.
  {
    __m128i out0, out1, out2, out3, out4, out5;
    VP8PlanarTo24bHelper(tmp, out);
    VP8PlanarTo24bHelper(out, *in);
  }
}